

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

void __thiscall
slang::ast::Compilation::Compilation(Compilation *this,Bag *options,SourceLibrary *defaultLib)

{
  flat_hash_map<syntax::SyntaxKind,_const_Type_*> *this_00;
  size_t *psVar1;
  group_type_pointer pgVar2;
  group_type_pointer pgVar3;
  group_type_pointer pgVar4;
  group_type_pointer pgVar5;
  group15<boost::unordered::detail::foa::plain_integral> *pgVar6;
  value_type_pointer ppVar7;
  Type *pTVar8;
  value_type_pointer ppVar9;
  void *pvVar10;
  RootSymbol *p;
  group_type_pointer pgVar11;
  value_type_pointer ppVar12;
  uint uVar13;
  ushort uVar14;
  flat_hash_map<std::tuple<DiagCode,_SourceLocation>,_std::vector<Diagnostic>_> *pfVar15;
  flat_hash_map<const_syntax::SyntaxNode_*,_std::pair<ConstantValue,_const_syntax::SyntaxNode_*>_>
  *pfVar16;
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  uchar uVar22;
  byte bVar23;
  uchar uVar24;
  uchar uVar25;
  uchar uVar26;
  byte bVar27;
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  byte bVar31;
  undefined4 uVar32;
  size_t __n;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *phVar33;
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  byte bVar37;
  uchar uVar38;
  uchar uVar39;
  uchar uVar40;
  byte bVar41;
  uchar uVar42;
  uchar uVar43;
  uchar uVar44;
  byte bVar45;
  uchar uVar46;
  uchar uVar47;
  uchar uVar48;
  byte bVar49;
  bitmask<slang::ast::IntegralFlags> bVar50;
  bool bVar51;
  byte bVar52;
  int iVar53;
  pointer __p;
  ulong uVar54;
  NetType *pNVar55;
  RootSymbol *thisSym_;
  PackageSymbol *pPVar56;
  value_type_pointer ppVar57;
  long *plVar58;
  ulong uVar59;
  uint uVar60;
  SourceLibrary *pSVar61;
  ulong uVar62;
  long lVar63;
  ulong uVar64;
  string_view *sv;
  value_type_pointer ppVar65;
  size_type __rlen;
  long *in_FS_OFFSET;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  uchar uVar80;
  uchar uVar107;
  uchar uVar108;
  byte bVar109;
  uchar uVar110;
  uchar uVar111;
  uchar uVar112;
  byte bVar113;
  uchar uVar114;
  uchar uVar115;
  uchar uVar116;
  byte bVar117;
  uchar uVar118;
  uchar uVar119;
  uchar uVar120;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  byte bVar121;
  string_view sVar122;
  locator res;
  size_t pos;
  value_type *elements;
  try_emplace_args_t local_3d9;
  basic_string_view<char,_std::char_traits<char>_> local_3d8;
  undefined1 local_3c8 [20];
  uint uStack_3b4;
  long lStack_3b0;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::parsing::TokenKind,_void>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
  *local_3a8;
  SourceLibrary *local_3a0;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *local_398;
  ulong local_390;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *local_388;
  ulong local_380;
  value_type_pointer local_378;
  default_delete<slang::SourceLibrary> *local_370;
  SourceLibrary *local_368;
  TypedBumpAllocator<slang::ConstantValue> *local_360;
  uint64_t local_358;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  *local_350;
  table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  *local_348;
  vector<std::shared_ptr<slang::ast::SystemSubroutine>,_std::allocator<std::shared_ptr<slang::ast::SystemSubroutine>_>_>
  *local_340;
  uchar local_338;
  uchar uStack_337;
  uchar uStack_336;
  byte bStack_335;
  uchar uStack_334;
  uchar uStack_333;
  uchar uStack_332;
  byte bStack_331;
  uchar uStack_330;
  uchar uStack_32f;
  uchar uStack_32e;
  byte bStack_32d;
  uchar uStack_32c;
  uchar uStack_32b;
  uchar uStack_32a;
  byte bStack_329;
  size_t local_320;
  Diagnostic *local_318;
  TypedBumpAllocator<slang::ast::Scope::WildcardImportData> *local_310;
  TypedBumpAllocator<slang::ast::ConfigBlockSymbol> *local_308;
  TypedBumpAllocator<slang::ast::AssertionInstanceDetails> *local_300;
  TypedBumpAllocator<slang::ast::GenericClassDefSymbol> *local_2f8;
  TypedBumpAllocator<boost::unordered::unordered_flat_map<unsigned_long,_unsigned_long,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
  *local_2f0;
  TypedBumpAllocator<boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
  *local_2e8;
  CompilationOptions *local_2e0;
  SafeIndexedVector<slang::ast::Scope::DeferredMemberData,_slang::ast::Scope::DeferredMemberIndex>
  *local_2d8;
  ulong local_2d0;
  ulong local_2c8;
  group_type_pointer local_2c0;
  uchar local_2b8;
  uchar uStack_2b7;
  uchar uStack_2b6;
  byte bStack_2b5;
  uchar uStack_2b4;
  uchar uStack_2b3;
  uchar uStack_2b2;
  byte bStack_2b1;
  uchar uStack_2b0;
  uchar uStack_2af;
  uchar uStack_2ae;
  byte bStack_2ad;
  uchar uStack_2ac;
  uchar uStack_2ab;
  uchar uStack_2aa;
  byte bStack_2a9;
  uchar local_2a8;
  uchar uStack_2a7;
  uchar uStack_2a6;
  byte bStack_2a5;
  uchar uStack_2a4;
  uchar uStack_2a3;
  uchar uStack_2a2;
  byte bStack_2a1;
  uchar uStack_2a0;
  uchar uStack_29f;
  uchar uStack_29e;
  byte bStack_29d;
  uchar uStack_29c;
  uchar uStack_29b;
  uchar uStack_29a;
  byte bStack_299;
  uchar local_298;
  uchar uStack_297;
  uchar uStack_296;
  uchar uStack_295;
  uchar uStack_294;
  uchar uStack_293;
  uchar uStack_292;
  uchar uStack_291;
  uchar uStack_290;
  uchar uStack_28f;
  uchar uStack_28e;
  uchar uStack_28d;
  uchar uStack_28c;
  uchar uStack_28b;
  uchar uStack_28a;
  byte bStack_289;
  uchar local_288;
  uchar uStack_287;
  uchar uStack_286;
  uchar uStack_285;
  uchar uStack_284;
  uchar uStack_283;
  uchar uStack_282;
  uchar uStack_281;
  uchar uStack_280;
  uchar uStack_27f;
  uchar uStack_27e;
  uchar uStack_27d;
  uchar uStack_27c;
  uchar uStack_27b;
  uchar uStack_27a;
  byte bStack_279;
  uchar local_278;
  uchar uStack_277;
  uchar uStack_276;
  uchar uStack_275;
  uchar uStack_274;
  uchar uStack_273;
  uchar uStack_272;
  uchar uStack_271;
  uchar uStack_270;
  uchar uStack_26f;
  uchar uStack_26e;
  uchar uStack_26d;
  uchar uStack_26c;
  uchar uStack_26b;
  uchar uStack_26a;
  byte bStack_269;
  uchar local_268;
  uchar uStack_267;
  uchar uStack_266;
  uchar uStack_265;
  uchar uStack_264;
  uchar uStack_263;
  uchar uStack_262;
  uchar uStack_261;
  uchar uStack_260;
  uchar uStack_25f;
  uchar uStack_25e;
  uchar uStack_25d;
  uchar uStack_25c;
  uchar uStack_25b;
  uchar uStack_25a;
  byte bStack_259;
  uchar local_258;
  uchar uStack_257;
  uchar uStack_256;
  uchar uStack_255;
  uchar uStack_254;
  uchar uStack_253;
  uchar uStack_252;
  uchar uStack_251;
  uchar uStack_250;
  uchar uStack_24f;
  uchar uStack_24e;
  uchar uStack_24d;
  uchar uStack_24c;
  uchar uStack_24b;
  uchar uStack_24a;
  byte bStack_249;
  uchar local_248;
  uchar uStack_247;
  uchar uStack_246;
  uchar uStack_245;
  uchar uStack_244;
  uchar uStack_243;
  uchar uStack_242;
  uchar uStack_241;
  uchar uStack_240;
  uchar uStack_23f;
  uchar uStack_23e;
  uchar uStack_23d;
  uchar uStack_23c;
  uchar uStack_23b;
  uchar uStack_23a;
  byte bStack_239;
  uchar local_238;
  uchar uStack_237;
  uchar uStack_236;
  uchar uStack_235;
  uchar uStack_234;
  uchar uStack_233;
  uchar uStack_232;
  uchar uStack_231;
  uchar uStack_230;
  uchar uStack_22f;
  uchar uStack_22e;
  uchar uStack_22d;
  uchar uStack_22c;
  uchar uStack_22b;
  uchar uStack_22a;
  byte bStack_229;
  uchar local_228;
  uchar uStack_227;
  uchar uStack_226;
  uchar uStack_225;
  uchar uStack_224;
  uchar uStack_223;
  uchar uStack_222;
  uchar uStack_221;
  uchar uStack_220;
  uchar uStack_21f;
  uchar uStack_21e;
  uchar uStack_21d;
  uchar uStack_21c;
  uchar uStack_21b;
  uchar uStack_21a;
  byte bStack_219;
  uchar local_218;
  uchar uStack_217;
  uchar uStack_216;
  uchar uStack_215;
  uchar uStack_214;
  uchar uStack_213;
  uchar uStack_212;
  uchar uStack_211;
  uchar uStack_210;
  uchar uStack_20f;
  uchar uStack_20e;
  uchar uStack_20d;
  uchar uStack_20c;
  uchar uStack_20b;
  uchar uStack_20a;
  byte bStack_209;
  uchar local_208;
  uchar uStack_207;
  uchar uStack_206;
  uchar uStack_205;
  uchar uStack_204;
  uchar uStack_203;
  uchar uStack_202;
  uchar uStack_201;
  uchar uStack_200;
  uchar uStack_1ff;
  uchar uStack_1fe;
  uchar uStack_1fd;
  uchar uStack_1fc;
  uchar uStack_1fb;
  uchar uStack_1fa;
  byte bStack_1f9;
  uchar local_1f8;
  uchar uStack_1f7;
  uchar uStack_1f6;
  uchar uStack_1f5;
  uchar uStack_1f4;
  uchar uStack_1f3;
  uchar uStack_1f2;
  uchar uStack_1f1;
  uchar uStack_1f0;
  uchar uStack_1ef;
  uchar uStack_1ee;
  uchar uStack_1ed;
  uchar uStack_1ec;
  uchar uStack_1eb;
  uchar uStack_1ea;
  uchar uStack_1e9;
  uchar local_1e8;
  uchar uStack_1e7;
  uchar uStack_1e6;
  uchar uStack_1e5;
  uchar uStack_1e4;
  uchar uStack_1e3;
  uchar uStack_1e2;
  uchar uStack_1e1;
  uchar uStack_1e0;
  uchar uStack_1df;
  uchar uStack_1de;
  uchar uStack_1dd;
  uchar uStack_1dc;
  uchar uStack_1db;
  uchar uStack_1da;
  uchar uStack_1d9;
  uchar local_1d8;
  uchar uStack_1d7;
  uchar uStack_1d6;
  uchar uStack_1d5;
  uchar uStack_1d4;
  uchar uStack_1d3;
  uchar uStack_1d2;
  uchar uStack_1d1;
  uchar uStack_1d0;
  uchar uStack_1cf;
  uchar uStack_1ce;
  uchar uStack_1cd;
  uchar uStack_1cc;
  uchar uStack_1cb;
  uchar uStack_1ca;
  byte bStack_1c9;
  uchar local_1c8;
  uchar uStack_1c7;
  uchar uStack_1c6;
  uchar uStack_1c5;
  uchar uStack_1c4;
  uchar uStack_1c3;
  uchar uStack_1c2;
  uchar uStack_1c1;
  uchar uStack_1c0;
  uchar uStack_1bf;
  uchar uStack_1be;
  uchar uStack_1bd;
  uchar uStack_1bc;
  uchar uStack_1bb;
  uchar uStack_1ba;
  byte bStack_1b9;
  uchar local_1b8;
  uchar uStack_1b7;
  uchar uStack_1b6;
  uchar uStack_1b5;
  uchar uStack_1b4;
  uchar uStack_1b3;
  uchar uStack_1b2;
  uchar uStack_1b1;
  uchar uStack_1b0;
  uchar uStack_1af;
  uchar uStack_1ae;
  uchar uStack_1ad;
  uchar uStack_1ac;
  uchar uStack_1ab;
  uchar uStack_1aa;
  byte bStack_1a9;
  uchar local_1a8;
  uchar uStack_1a7;
  uchar uStack_1a6;
  uchar uStack_1a5;
  uchar uStack_1a4;
  uchar uStack_1a3;
  uchar uStack_1a2;
  uchar uStack_1a1;
  uchar uStack_1a0;
  uchar uStack_19f;
  uchar uStack_19e;
  uchar uStack_19d;
  uchar uStack_19c;
  uchar uStack_19b;
  uchar uStack_19a;
  byte bStack_199;
  uchar local_198;
  uchar uStack_197;
  uchar uStack_196;
  uchar uStack_195;
  uchar uStack_194;
  uchar uStack_193;
  uchar uStack_192;
  uchar uStack_191;
  uchar uStack_190;
  uchar uStack_18f;
  uchar uStack_18e;
  uchar uStack_18d;
  uchar uStack_18c;
  uchar uStack_18b;
  uchar uStack_18a;
  byte bStack_189;
  uchar local_188;
  uchar uStack_187;
  uchar uStack_186;
  uchar uStack_185;
  uchar uStack_184;
  uchar uStack_183;
  uchar uStack_182;
  uchar uStack_181;
  uchar uStack_180;
  uchar uStack_17f;
  uchar uStack_17e;
  uchar uStack_17d;
  uchar uStack_17c;
  uchar uStack_17b;
  uchar uStack_17a;
  byte bStack_179;
  uchar local_178;
  uchar uStack_177;
  uchar uStack_176;
  uchar uStack_175;
  uchar uStack_174;
  uchar uStack_173;
  uchar uStack_172;
  uchar uStack_171;
  uchar uStack_170;
  uchar uStack_16f;
  uchar uStack_16e;
  uchar uStack_16d;
  uchar uStack_16c;
  uchar uStack_16b;
  uchar uStack_16a;
  byte bStack_169;
  uchar local_168;
  uchar uStack_167;
  uchar uStack_166;
  uchar uStack_165;
  uchar uStack_164;
  uchar uStack_163;
  uchar uStack_162;
  uchar uStack_161;
  uchar uStack_160;
  uchar uStack_15f;
  uchar uStack_15e;
  uchar uStack_15d;
  uchar uStack_15c;
  uchar uStack_15b;
  uchar uStack_15a;
  byte bStack_159;
  uchar local_158;
  uchar uStack_157;
  uchar uStack_156;
  uchar uStack_155;
  uchar uStack_154;
  uchar uStack_153;
  uchar uStack_152;
  uchar uStack_151;
  uchar uStack_150;
  uchar uStack_14f;
  uchar uStack_14e;
  uchar uStack_14d;
  uchar uStack_14c;
  uchar uStack_14b;
  uchar uStack_14a;
  byte bStack_149;
  uchar local_148;
  uchar uStack_147;
  uchar uStack_146;
  uchar uStack_145;
  uchar uStack_144;
  uchar uStack_143;
  uchar uStack_142;
  uchar uStack_141;
  uchar uStack_140;
  uchar uStack_13f;
  uchar uStack_13e;
  uchar uStack_13d;
  uchar uStack_13c;
  uchar uStack_13b;
  uchar uStack_13a;
  byte bStack_139;
  uchar local_138;
  uchar uStack_137;
  uchar uStack_136;
  uchar uStack_135;
  uchar uStack_134;
  uchar uStack_133;
  uchar uStack_132;
  uchar uStack_131;
  uchar uStack_130;
  uchar uStack_12f;
  uchar uStack_12e;
  uchar uStack_12d;
  uchar uStack_12c;
  uchar uStack_12b;
  uchar uStack_12a;
  byte bStack_129;
  uchar local_128;
  uchar uStack_127;
  uchar uStack_126;
  uchar uStack_125;
  uchar uStack_124;
  uchar uStack_123;
  uchar uStack_122;
  uchar uStack_121;
  uchar uStack_120;
  uchar uStack_11f;
  uchar uStack_11e;
  uchar uStack_11d;
  uchar uStack_11c;
  uchar uStack_11b;
  uchar uStack_11a;
  byte bStack_119;
  uchar local_118;
  uchar uStack_117;
  uchar uStack_116;
  uchar uStack_115;
  uchar uStack_114;
  uchar uStack_113;
  uchar uStack_112;
  uchar uStack_111;
  uchar uStack_110;
  uchar uStack_10f;
  uchar uStack_10e;
  uchar uStack_10d;
  uchar uStack_10c;
  uchar uStack_10b;
  uchar uStack_10a;
  byte bStack_109;
  uchar local_108;
  uchar uStack_107;
  uchar uStack_106;
  uchar uStack_105;
  uchar uStack_104;
  uchar uStack_103;
  uchar uStack_102;
  uchar uStack_101;
  uchar uStack_100;
  uchar uStack_ff;
  uchar uStack_fe;
  uchar uStack_fd;
  uchar uStack_fc;
  uchar uStack_fb;
  uchar uStack_fa;
  byte bStack_f9;
  uchar local_f8;
  uchar uStack_f7;
  uchar uStack_f6;
  uchar uStack_f5;
  uchar uStack_f4;
  uchar uStack_f3;
  uchar uStack_f2;
  uchar uStack_f1;
  uchar uStack_f0;
  uchar uStack_ef;
  uchar uStack_ee;
  uchar uStack_ed;
  uchar uStack_ec;
  uchar uStack_eb;
  uchar uStack_ea;
  byte bStack_e9;
  uchar local_e8;
  uchar uStack_e7;
  uchar uStack_e6;
  uchar uStack_e5;
  uchar uStack_e4;
  uchar uStack_e3;
  uchar uStack_e2;
  uchar uStack_e1;
  uchar uStack_e0;
  uchar uStack_df;
  uchar uStack_de;
  uchar uStack_dd;
  uchar uStack_dc;
  uchar uStack_db;
  uchar uStack_da;
  byte bStack_d9;
  uchar local_d8;
  uchar uStack_d7;
  uchar uStack_d6;
  uchar uStack_d5;
  uchar uStack_d4;
  uchar uStack_d3;
  uchar uStack_d2;
  uchar uStack_d1;
  uchar uStack_d0;
  uchar uStack_cf;
  uchar uStack_ce;
  uchar uStack_cd;
  uchar uStack_cc;
  uchar uStack_cb;
  uchar uStack_ca;
  byte bStack_c9;
  uchar local_c8;
  uchar uStack_c7;
  uchar uStack_c6;
  uchar uStack_c5;
  uchar uStack_c4;
  uchar uStack_c3;
  uchar uStack_c2;
  uchar uStack_c1;
  uchar uStack_c0;
  uchar uStack_bf;
  uchar uStack_be;
  uchar uStack_bd;
  uchar uStack_bc;
  uchar uStack_bb;
  uchar uStack_ba;
  byte bStack_b9;
  uchar local_b8;
  uchar uStack_b7;
  uchar uStack_b6;
  uchar uStack_b5;
  uchar uStack_b4;
  uchar uStack_b3;
  uchar uStack_b2;
  uchar uStack_b1;
  uchar uStack_b0;
  uchar uStack_af;
  uchar uStack_ae;
  uchar uStack_ad;
  uchar uStack_ac;
  uchar uStack_ab;
  uchar uStack_aa;
  byte bStack_a9;
  uchar local_a8;
  uchar uStack_a7;
  uchar uStack_a6;
  uchar uStack_a5;
  uchar uStack_a4;
  uchar uStack_a3;
  uchar uStack_a2;
  uchar uStack_a1;
  uchar uStack_a0;
  uchar uStack_9f;
  uchar uStack_9e;
  uchar uStack_9d;
  uchar uStack_9c;
  uchar uStack_9b;
  uchar uStack_9a;
  uchar uStack_99;
  uchar local_98;
  uchar uStack_97;
  uchar uStack_96;
  uchar uStack_95;
  uchar uStack_94;
  uchar uStack_93;
  uchar uStack_92;
  uchar uStack_91;
  uchar uStack_90;
  uchar uStack_8f;
  uchar uStack_8e;
  uchar uStack_8d;
  uchar uStack_8c;
  uchar uStack_8b;
  uchar uStack_8a;
  byte bStack_89;
  uchar local_88;
  uchar uStack_87;
  uchar uStack_86;
  uchar uStack_85;
  uchar uStack_84;
  uchar uStack_83;
  uchar uStack_82;
  uchar uStack_81;
  uchar uStack_80;
  uchar uStack_7f;
  uchar uStack_7e;
  uchar uStack_7d;
  uchar uStack_7c;
  uchar uStack_7b;
  uchar uStack_7a;
  uchar uStack_79;
  uchar local_78;
  uchar uStack_77;
  uchar uStack_76;
  uchar uStack_75;
  uchar uStack_74;
  uchar uStack_73;
  uchar uStack_72;
  uchar uStack_71;
  uchar uStack_70;
  uchar uStack_6f;
  uchar uStack_6e;
  uchar uStack_6d;
  uchar uStack_6c;
  uchar uStack_6b;
  uchar uStack_6a;
  byte bStack_69;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  uchar uStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  uchar uStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  uchar uStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  byte bStack_59;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  uchar uStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  uchar uStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  uchar uStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  uchar uStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  uchar uStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  uchar uStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  BumpAllocator::BumpAllocator(&this->super_BumpAllocator);
  Bag::getOrDefault<slang::ast::CompilationOptions>(&this->options,options);
  BumpAllocator::BumpAllocator(&(this->symbolMapAllocator).super_BumpAllocator);
  BumpAllocator::BumpAllocator(&(this->pointerMapAllocator).super_BumpAllocator);
  BumpAllocator::BumpAllocator(&(this->constantAllocator).super_BumpAllocator);
  (this->driverMapAllocator).alloc = &this->super_BumpAllocator;
  (this->driverMapAllocator).freeList = (FreeNode *)0x0;
  (this->unrollIntervalMapAllocator).alloc = &this->super_BumpAllocator;
  local_2d8 = &this->deferredData;
  *(undefined1 (*) [16])&(this->unrollIntervalMapAllocator).freeList = (undefined1  [16])0x0;
  this->scalarTypeTable[1] = (Type *)0x0;
  this->scalarTypeTable[2] = (Type *)0x0;
  this->scalarTypeTable[3] = (Type *)0x0;
  this->scalarTypeTable[4] = (Type *)0x0;
  this->scalarTypeTable[5] = (Type *)0x0;
  this->scalarTypeTable[6] = (Type *)0x0;
  this->scalarTypeTable[7] = (Type *)0x0;
  local_360 = &this->constantAllocator;
  SafeIndexedVector<slang::ast::Scope::DeferredMemberData,_slang::ast::Scope::DeferredMemberIndex>::
  SafeIndexedVector(local_2d8);
  (this->referenceStatusMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<bool,_bool>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<bool,_bool>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->referenceStatusMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<bool,_bool>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<bool,_bool>_>_>_>
  .arrays.groups_size_mask = 1;
  (this->referenceStatusMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<bool,_bool>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<bool,_bool>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->referenceStatusMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<bool,_bool>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<bool,_bool>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (this->referenceStatusMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<bool,_bool>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<bool,_bool>_>_>_>
  .size_ctrl.ml = 0;
  (this->referenceStatusMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<bool,_bool>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<bool,_bool>_>_>_>
  .size_ctrl.size = 0;
  (this->definitionMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->definitionMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
  .arrays.groups_size_mask = 1;
  (this->definitionMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->definitionMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (this->definitionMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
  .size_ctrl.ml = 0;
  (this->definitionMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
  .size_ctrl.size = 0;
  (this->vectorTypeCache).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->vectorTypeCache).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
  .arrays.groups_size_mask = 1;
  (this->vectorTypeCache).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->vectorTypeCache).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (this->vectorTypeCache).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
  .size_ctrl.ml = 0;
  (this->vectorTypeCache).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
  .size_ctrl.size = 0;
  (this->knownTypes).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->knownTypes).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
  .arrays.groups_size_mask = 1;
  (this->knownTypes).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->knownTypes).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (this->knownTypes).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
  .size_ctrl.ml = 0;
  (this->knownTypes).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
  .size_ctrl.size = 0;
  local_3a8 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::parsing::TokenKind,_void>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
               *)&this->knownNetTypes;
  (this->knownNetTypes).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->knownNetTypes).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
  .arrays.groups_size_mask = 1;
  (this->knownNetTypes).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->knownNetTypes).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (this->knownNetTypes).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
  .size_ctrl.ml = 0;
  (this->knownNetTypes).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
  .size_ctrl.size = 0;
  local_398 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)&this->packageMap
  ;
  (this->packageMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->packageMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
  .arrays.groups_size_mask = 1;
  (this->packageMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->packageMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  local_340 = &this->systemSubroutines;
  local_348 = (table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
               *)&this->methodMap;
  (this->systemSubroutines).
  super__Vector_base<std::shared_ptr<slang::ast::SystemSubroutine>,_std::allocator<std::shared_ptr<slang::ast::SystemSubroutine>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->systemSubroutines).
  super__Vector_base<std::shared_ptr<slang::ast::SystemSubroutine>,_std::allocator<std::shared_ptr<slang::ast::SystemSubroutine>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->systemSubroutines).
  super__Vector_base<std::shared_ptr<slang::ast::SystemSubroutine>,_std::allocator<std::shared_ptr<slang::ast::SystemSubroutine>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->packageMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
  .size_ctrl.ml = 0;
  (this->packageMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
  .size_ctrl.size = 0;
  (this->methodMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->methodMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  .arrays.groups_size_mask = 1;
  (this->methodMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->methodMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (this->methodMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  .size_ctrl.ml = 0;
  (this->methodMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  .size_ctrl.size = 0;
  (this->instanceSideEffectMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->instanceSideEffectMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
  .arrays.groups_size_mask = 1;
  (this->instanceSideEffectMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->instanceSideEffectMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (this->instanceSideEffectMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
  .size_ctrl.ml = 0;
  (this->instanceSideEffectMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
  .size_ctrl.size = 0;
  (this->attributeMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->attributeMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
  .arrays.groups_size_mask = 1;
  (this->attributeMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->attributeMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (this->attributeMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
  .size_ctrl.ml = 0;
  (this->attributeMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
  .size_ctrl.size = 0;
  (this->syntaxMetadata).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->syntaxMetadata).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
  .arrays.groups_size_mask = 1;
  (this->syntaxMetadata).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->syntaxMetadata).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (this->definitionMemory).
  super__Vector_base<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>,_std::allocator<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->definitionMemory).
  super__Vector_base<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>,_std::allocator<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->definitionMemory).
  super__Vector_base<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>,_std::allocator<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->syntaxMetadata).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
  .size_ctrl.ml = 0;
  (this->syntaxMetadata).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
  .size_ctrl.size = 0;
  (this->diagMap).map.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->diagMap).map.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>_>_>
  .arrays.groups_size_mask = 1;
  (this->diagMap).map.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->diagMap).map.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (this->hierarchicalAssignments).
  super__Vector_base<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->hierarchicalAssignments).
  super__Vector_base<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->hierarchicalAssignments).
  super__Vector_base<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->virtualInterfaceInstances).
  super__Vector_base<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->virtualInterfaceInstances).
  super__Vector_base<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->defaultLiblist).
    super__Vector_base<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->defaultLiblist).
  super__Vector_base<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->defaultLiblist).
  super__Vector_base<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pfVar15 = &(this->diagMap).map;
  (pfVar15->table_).
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>_>_>
  .size_ctrl.ml = 0;
  (pfVar15->table_).
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic>_>_>_>
  .size_ctrl.size = 0;
  (this->outOfBlockDecls).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->outOfBlockDecls).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
  .arrays.groups_size_mask = 1;
  (this->outOfBlockDecls).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->outOfBlockDecls).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  *(undefined1 (*) [16])((long)&this->sourceManager + 5) = (undefined1  [16])0x0;
  this->root = (__uniq_ptr_data<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>,_true,_true>
                )0x0;
  this->sourceManager = (SourceManager *)0x0;
  (this->outOfBlockDecls).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
  .size_ctrl.ml = 0;
  (this->outOfBlockDecls).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
  .size_ctrl.size = 0;
  this->typoCorrections = 0;
  this->nextEnumSystemId = 1;
  this->nextStructSystemId = 1;
  this->nextUnionSystemId = 1;
  local_2f8 = &this->genericClassAllocator;
  local_2f0 = &this->pointerMapAllocator;
  local_2e8 = &this->symbolMapAllocator;
  local_2e0 = &this->options;
  BumpAllocator::BumpAllocator(&local_2f8->super_BumpAllocator);
  local_300 = &this->assertionDetailsAllocator;
  BumpAllocator::BumpAllocator(&local_300->super_BumpAllocator);
  local_308 = &this->configBlockAllocator;
  BumpAllocator::BumpAllocator(&local_308->super_BumpAllocator);
  local_310 = &this->wildcardImportAllocator;
  local_3a0 = defaultLib;
  BumpAllocator::BumpAllocator(&local_310->super_BumpAllocator);
  this_00 = &this->knownTypes;
  local_318 = &this->tempDiag;
  Diagnostic::Diagnostic(local_318,(DiagCode)0x0,(SourceLocation)0x0);
  (this->cachedParseDiagnostics).super__Optional_base<slang::Diagnostics,_false,_false>._M_payload.
  super__Optional_payload<slang::Diagnostics,_true,_false,_false>.
  super__Optional_payload_base<slang::Diagnostics>._M_engaged = false;
  (this->cachedSemanticDiagnostics).super__Optional_base<slang::Diagnostics,_false,_false>.
  _M_payload.super__Optional_payload<slang::Diagnostics,_true,_false,_false>.
  super__Optional_payload_base<slang::Diagnostics>._M_engaged = false;
  (this->cachedAllDiagnostics).super__Optional_base<slang::Diagnostics,_false,_false>._M_payload.
  super__Optional_payload<slang::Diagnostics,_true,_false,_false>.
  super__Optional_payload_base<slang::Diagnostics>._M_engaged = false;
  (this->compilationUnits).
  super__Vector_base<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->compilationUnits).
  super__Vector_base<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->compilationUnits).
    super__Vector_base<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->syntaxTrees).
  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->syntaxTrees).
  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->unreferencedDefs).
  super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->unreferencedDefs).
  super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->unreferencedDefs).
  super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->gateMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->gateMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>_>_>
  .arrays.groups_size_mask = 1;
  (this->gateMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->gateMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (this->gateMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>_>_>
  .size_ctrl.ml = 0;
  (this->gateMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PrimitiveSymbol_*>_>_>
  .size_ctrl.size = 0;
  (this->definitionFromSyntax).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->definitionFromSyntax).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
  .arrays.groups_size_mask = 1;
  (this->definitionFromSyntax).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->definitionFromSyntax).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (this->definitionFromSyntax).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
  .size_ctrl.ml = 0;
  (this->definitionFromSyntax).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
  .size_ctrl.size = 0;
  (this->globalInstantiations).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->globalInstantiations).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .arrays.groups_size_mask = 1;
  (this->globalInstantiations).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->globalInstantiations).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (this->globalInstantiations).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .size_ctrl.ml = 0;
  (this->globalInstantiations).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .size_ctrl.size = 0;
  (this->hierarchyOverrides).paramOverrides.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->hierarchyOverrides).paramOverrides.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
  .arrays.groups_size_mask = 1;
  (this->hierarchyOverrides).paramOverrides.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->hierarchyOverrides).paramOverrides.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  pfVar16 = &(this->hierarchyOverrides).paramOverrides;
  (pfVar16->table_).
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
  .size_ctrl.ml = 0;
  (pfVar16->table_).
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
  .size_ctrl.size = 0;
  (this->hierarchyOverrides).childNodes.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->hierarchyOverrides).childNodes.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
  .arrays.groups_size_mask = 1;
  (this->hierarchyOverrides).childNodes.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->hierarchyOverrides).childNodes.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  memset(&(this->hierarchyOverrides).childNodes.table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
          .size_ctrl,0,0x88);
  (this->defaultClockingMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->defaultClockingMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
  .arrays.groups_size_mask = 1;
  (this->defaultClockingMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->defaultClockingMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (this->defaultClockingMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
  .size_ctrl.ml = 0;
  (this->defaultClockingMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
  .size_ctrl.size = 0;
  (this->globalClockingMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Symbol_*>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->globalClockingMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Symbol_*>_>_>
  .arrays.groups_size_mask = 1;
  (this->globalClockingMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Symbol_*>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->globalClockingMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Symbol_*>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (this->globalClockingMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Symbol_*>_>_>
  .size_ctrl.ml = 0;
  (this->globalClockingMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Symbol_*>_>_>
  .size_ctrl.size = 0;
  (this->defaultDisableMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->defaultDisableMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
  .arrays.groups_size_mask = 1;
  (this->defaultDisableMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->defaultDisableMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (this->defaultDisableMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
  .size_ctrl.ml = 0;
  (this->defaultDisableMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Expression_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
  .size_ctrl.size = 0;
  (this->configBlocks).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->configBlocks).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
  .arrays.groups_size_mask = 1;
  (this->configBlocks).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->configBlocks).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (this->configBlocks).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
  .size_ctrl.ml = 0;
  (this->configBlocks).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
  .size_ctrl.size = 0;
  (this->configBySyntax).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->configBySyntax).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
  .arrays.groups_size_mask = 1;
  (this->configBySyntax).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->configBySyntax).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (this->configBySyntax).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
  .size_ctrl.ml = 0;
  (this->configBySyntax).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
  .size_ctrl.size = 0;
  local_388 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
              &this->libraryNameMap;
  (this->libraryNameMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->libraryNameMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
  .arrays.groups_size_mask = 1;
  (this->libraryNameMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->libraryNameMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (this->libraryNameMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
  .size_ctrl.ml = 0;
  (this->libraryNameMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
  .size_ctrl.size = 0;
  (this->instancesWithDefBinds).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::DefinitionSymbol_*,_std::vector<const_slang::ast::Symbol_*>_>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<std::pair<const_slang::ast::DefinitionSymbol_*const,_std::vector<const_slang::ast::Symbol_*>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->instancesWithDefBinds).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::DefinitionSymbol_*,_std::vector<const_slang::ast::Symbol_*>_>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<std::pair<const_slang::ast::DefinitionSymbol_*const,_std::vector<const_slang::ast::Symbol_*>_>_>_>
  .arrays.groups_size_mask = 1;
  (this->instancesWithDefBinds).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::DefinitionSymbol_*,_std::vector<const_slang::ast::Symbol_*>_>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<std::pair<const_slang::ast::DefinitionSymbol_*const,_std::vector<const_slang::ast::Symbol_*>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->instancesWithDefBinds).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::DefinitionSymbol_*,_std::vector<const_slang::ast::Symbol_*>_>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<std::pair<const_slang::ast::DefinitionSymbol_*const,_std::vector<const_slang::ast::Symbol_*>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (this->instancesWithDefBinds).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::DefinitionSymbol_*,_std::vector<const_slang::ast::Symbol_*>_>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<std::pair<const_slang::ast::DefinitionSymbol_*const,_std::vector<const_slang::ast::Symbol_*>_>_>_>
  .size_ctrl.ml = 0;
  (this->instancesWithDefBinds).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::DefinitionSymbol_*,_std::vector<const_slang::ast::Symbol_*>_>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<std::pair<const_slang::ast::DefinitionSymbol_*const,_std::vector<const_slang::ast::Symbol_*>_>_>_>
  .size_ctrl.size = 0;
  (this->externDefMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->externDefMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>_>_>
  .arrays.groups_size_mask = 1;
  (this->externDefMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->externDefMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (this->externDefMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>_>_>
  .size_ctrl.ml = 0;
  (this->externDefMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>_>_>
  .size_ctrl.size = 0;
  (this->netAliasAllocator).alloc = &this->super_BumpAllocator;
  (this->netAliasAllocator).freeList = (FreeNode *)0x0;
  (this->netAliases).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->netAliases).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>_>_>
  .arrays.groups_size_mask = 1;
  (this->netAliases).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->netAliases).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (this->netAliases).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>_>_>
  .size_ctrl.ml = 0;
  (this->netAliases).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*>_>_>_>
  .size_ctrl.size = 0;
  local_350 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
               *)&this->subroutineNameMap;
  (this->subroutineNameMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->subroutineNameMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  .arrays.groups_size_mask = 1;
  (this->subroutineNameMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->subroutineNameMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  local_370 = (default_delete<slang::SourceLibrary> *)&this->defaultLibMem;
  this->stdPkg = (PackageSymbol *)0x0;
  this->defaultLibMem =
       (__uniq_ptr_data<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>,_true,_true>
       )0x0;
  (this->subroutineNameMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  .size_ctrl.ml = 0;
  (this->subroutineNameMap).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  .size_ctrl.size = 0;
  this->defaultLibPtr = local_3a0;
  this->bitType = (Type *)ast::builtins::Builtins::Instance;
  this->logicType = (Type *)(ast::builtins::Builtins::Instance + 0x58);
  this->intType = (Type *)(ast::builtins::Builtins::Instance + 0x210);
  this->byteType = (Type *)(ast::builtins::Builtins::Instance + 0x2c0);
  this->integerType = (Type *)(ast::builtins::Builtins::Instance + 0x318);
  this->realType = (Type *)(ast::builtins::Builtins::Instance + 0x4d0);
  this->shortRealType = (Type *)(ast::builtins::Builtins::Instance + 0x520);
  this->stringType = (Type *)(ast::builtins::Builtins::Instance + 0x5c0);
  this->voidType = (Type *)(ast::builtins::Builtins::Instance + 0x608);
  this->errorType = (Type *)(ast::builtins::Builtins::Instance + 0x890);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::syntax::SyntaxKind,_void>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
  ::rehash((table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::syntax::SyntaxKind,_void>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
            *)this_00,0x25);
  local_3d8._M_len._0_4_ = 0x1a7;
  uVar32 = (undefined4)local_3d8._M_len;
  local_3d8._M_len._0_4_ = 0x1a7;
  uVar54 = 0x6daa2181541307b6 >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  local_3a0 = (SourceLibrary *)&this->stdPkg;
  ppVar7 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar59 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar62 = 0;
  uVar64 = uVar54;
  do {
    pgVar2 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar64;
    local_48 = pgVar2->m[0].n;
    uStack_47 = pgVar2->m[1].n;
    uStack_46 = pgVar2->m[2].n;
    uStack_45 = pgVar2->m[3].n;
    uStack_44 = pgVar2->m[4].n;
    uStack_43 = pgVar2->m[5].n;
    uStack_42 = pgVar2->m[6].n;
    uStack_41 = pgVar2->m[7].n;
    uStack_40 = pgVar2->m[8].n;
    uStack_3f = pgVar2->m[9].n;
    uStack_3e = pgVar2->m[10].n;
    uStack_3d = pgVar2->m[0xb].n;
    uStack_3c = pgVar2->m[0xc].n;
    uStack_3b = pgVar2->m[0xd].n;
    uStack_3a = pgVar2->m[0xe].n;
    bStack_39 = pgVar2->m[0xf].n;
    auVar66[0] = -(local_48 == 0xb6);
    auVar66[1] = -(uStack_47 == 0xb6);
    auVar66[2] = -(uStack_46 == 0xb6);
    auVar66[3] = -(uStack_45 == 0xb6);
    auVar66[4] = -(uStack_44 == 0xb6);
    auVar66[5] = -(uStack_43 == 0xb6);
    auVar66[6] = -(uStack_42 == 0xb6);
    auVar66[7] = -(uStack_41 == 0xb6);
    auVar66[8] = -(uStack_40 == 0xb6);
    auVar66[9] = -(uStack_3f == 0xb6);
    auVar66[10] = -(uStack_3e == 0xb6);
    auVar66[0xb] = -(uStack_3d == 0xb6);
    auVar66[0xc] = -(uStack_3c == 0xb6);
    auVar66[0xd] = -(uStack_3b == 0xb6);
    auVar66[0xe] = -(uStack_3a == 0xb6);
    auVar66[0xf] = -(bStack_39 == 0xb6);
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar66 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar66 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar66 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar66 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar66 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar66 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar66 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar66 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar66 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar66 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar66 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar66 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar66 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar66 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar66 >> 0x77,0) & 1) << 0xe); uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      iVar53 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
        }
      }
      if (*(int *)((long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 0x1a7) {
        lVar63 = (long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
        goto LAB_002d1c81;
      }
    }
    if ((bStack_39 & 0x40) == 0) break;
    lVar63 = uVar64 + uVar62;
    uVar62 = uVar62 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar62 <= uVar59);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,(arrays_type *)this_00,uVar54,0x6daa2181541307b6,&local_3d9,
               (SyntaxKind *)&local_3d8);
    psVar1 = &(this->knownTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    local_3d8._M_len._0_4_ = uVar32;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0x6daa2181541307b6,&local_3d9,(SyntaxKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d1c81:
  *(undefined8 *)(lVar63 + 8) = 0x5f5020;
  pTVar8 = this->intType;
  local_3d8._M_len._0_4_ = 0xff;
  uVar32 = (undefined4)local_3d8._M_len;
  local_3d8._M_len._0_4_ = 0xff;
  uVar54 = 0x99423fc5cb319876 >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar7 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar59 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar62 = 0;
  uVar64 = uVar54;
  do {
    pgVar2 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar64;
    local_58 = pgVar2->m[0].n;
    uStack_57 = pgVar2->m[1].n;
    uStack_56 = pgVar2->m[2].n;
    uStack_55 = pgVar2->m[3].n;
    uStack_54 = pgVar2->m[4].n;
    uStack_53 = pgVar2->m[5].n;
    uStack_52 = pgVar2->m[6].n;
    uStack_51 = pgVar2->m[7].n;
    uStack_50 = pgVar2->m[8].n;
    uStack_4f = pgVar2->m[9].n;
    uStack_4e = pgVar2->m[10].n;
    uStack_4d = pgVar2->m[0xb].n;
    uStack_4c = pgVar2->m[0xc].n;
    uStack_4b = pgVar2->m[0xd].n;
    uStack_4a = pgVar2->m[0xe].n;
    bStack_49 = pgVar2->m[0xf].n;
    auVar81[0] = -(local_58 == 'v');
    auVar81[1] = -(uStack_57 == 'v');
    auVar81[2] = -(uStack_56 == 'v');
    auVar81[3] = -(uStack_55 == 'v');
    auVar81[4] = -(uStack_54 == 'v');
    auVar81[5] = -(uStack_53 == 'v');
    auVar81[6] = -(uStack_52 == 'v');
    auVar81[7] = -(uStack_51 == 'v');
    auVar81[8] = -(uStack_50 == 'v');
    auVar81[9] = -(uStack_4f == 'v');
    auVar81[10] = -(uStack_4e == 'v');
    auVar81[0xb] = -(uStack_4d == 'v');
    auVar81[0xc] = -(uStack_4c == 'v');
    auVar81[0xd] = -(uStack_4b == 'v');
    auVar81[0xe] = -(uStack_4a == 'v');
    auVar81[0xf] = -(bStack_49 == 0x76);
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar81 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar81 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar81 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar81 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar81 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar81 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar81 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar81 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar81 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar81 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar81 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar81 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar81 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar81 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar81 >> 0x77,0) & 1) << 0xe); uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      iVar53 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
        }
      }
      if (*(int *)((long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 0xff) {
        lVar63 = (long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
        goto LAB_002d1d99;
      }
    }
    if ((bStack_49 & 0x40) == 0) break;
    lVar63 = uVar64 + uVar62;
    uVar62 = uVar62 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar62 <= uVar59);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,(arrays_type *)this_00,uVar54,0x99423fc5cb319876,&local_3d9,
               (SyntaxKind *)&local_3d8);
    psVar1 = &(this->knownTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    local_3d8._M_len._0_4_ = uVar32;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0x99423fc5cb319876,&local_3d9,(SyntaxKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d1d99:
  *(Type **)(lVar63 + 8) = pTVar8;
  local_3d8._M_len._0_4_ = 0x11d;
  uVar32 = (undefined4)local_3d8._M_len;
  local_3d8._M_len._0_4_ = 0x11d;
  uVar54 = 0x23c28382b5ec23d1 >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar7 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar59 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar62 = 0;
  uVar64 = uVar54;
  do {
    pgVar2 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar64;
    local_68 = pgVar2->m[0].n;
    uStack_67 = pgVar2->m[1].n;
    uStack_66 = pgVar2->m[2].n;
    uStack_65 = pgVar2->m[3].n;
    uStack_64 = pgVar2->m[4].n;
    uStack_63 = pgVar2->m[5].n;
    uStack_62 = pgVar2->m[6].n;
    uStack_61 = pgVar2->m[7].n;
    uStack_60 = pgVar2->m[8].n;
    uStack_5f = pgVar2->m[9].n;
    uStack_5e = pgVar2->m[10].n;
    uStack_5d = pgVar2->m[0xb].n;
    uStack_5c = pgVar2->m[0xc].n;
    uStack_5b = pgVar2->m[0xd].n;
    uStack_5a = pgVar2->m[0xe].n;
    bStack_59 = pgVar2->m[0xf].n;
    auVar67[0] = -(local_68 == 0xd1);
    auVar67[1] = -(uStack_67 == 0xd1);
    auVar67[2] = -(uStack_66 == 0xd1);
    auVar67[3] = -(uStack_65 == 0xd1);
    auVar67[4] = -(uStack_64 == 0xd1);
    auVar67[5] = -(uStack_63 == 0xd1);
    auVar67[6] = -(uStack_62 == 0xd1);
    auVar67[7] = -(uStack_61 == 0xd1);
    auVar67[8] = -(uStack_60 == 0xd1);
    auVar67[9] = -(uStack_5f == 0xd1);
    auVar67[10] = -(uStack_5e == 0xd1);
    auVar67[0xb] = -(uStack_5d == 0xd1);
    auVar67[0xc] = -(uStack_5c == 0xd1);
    auVar67[0xd] = -(uStack_5b == 0xd1);
    auVar67[0xe] = -(uStack_5a == 0xd1);
    auVar67[0xf] = -(bStack_59 == 0xd1);
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar67 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar67 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar67 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar67 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar67 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar67 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar67 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar67 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar67 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar67 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar67 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar67 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar67 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar67 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar67 >> 0x77,0) & 1) << 0xe); uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      iVar53 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
        }
      }
      if (*(int *)((long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 0x11d) {
        lVar63 = (long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
        goto LAB_002d1eaf;
      }
    }
    if ((bStack_59 & 2) == 0) break;
    lVar63 = uVar64 + uVar62;
    uVar62 = uVar62 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar62 <= uVar59);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,(arrays_type *)this_00,uVar54,0x23c28382b5ec23d1,&local_3d9,
               (SyntaxKind *)&local_3d8);
    psVar1 = &(this->knownTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    local_3d8._M_len._0_4_ = uVar32;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0x23c28382b5ec23d1,&local_3d9,(SyntaxKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d1eaf:
  *(undefined8 *)(lVar63 + 8) = 0x5f5078;
  pTVar8 = this->byteType;
  local_3d8._M_len._0_4_ = 0x39;
  uVar32 = (undefined4)local_3d8._M_len;
  local_3d8._M_len._0_4_ = 0x39;
  uVar54 = 0x3a5a1a4d5795a08e >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar7 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar59 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar62 = 0;
  uVar64 = uVar54;
  do {
    pgVar2 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar64;
    local_78 = pgVar2->m[0].n;
    uStack_77 = pgVar2->m[1].n;
    uStack_76 = pgVar2->m[2].n;
    uStack_75 = pgVar2->m[3].n;
    uStack_74 = pgVar2->m[4].n;
    uStack_73 = pgVar2->m[5].n;
    uStack_72 = pgVar2->m[6].n;
    uStack_71 = pgVar2->m[7].n;
    uStack_70 = pgVar2->m[8].n;
    uStack_6f = pgVar2->m[9].n;
    uStack_6e = pgVar2->m[10].n;
    uStack_6d = pgVar2->m[0xb].n;
    uStack_6c = pgVar2->m[0xc].n;
    uStack_6b = pgVar2->m[0xd].n;
    uStack_6a = pgVar2->m[0xe].n;
    bStack_69 = pgVar2->m[0xf].n;
    auVar82[0] = -(local_78 == 0x8e);
    auVar82[1] = -(uStack_77 == 0x8e);
    auVar82[2] = -(uStack_76 == 0x8e);
    auVar82[3] = -(uStack_75 == 0x8e);
    auVar82[4] = -(uStack_74 == 0x8e);
    auVar82[5] = -(uStack_73 == 0x8e);
    auVar82[6] = -(uStack_72 == 0x8e);
    auVar82[7] = -(uStack_71 == 0x8e);
    auVar82[8] = -(uStack_70 == 0x8e);
    auVar82[9] = -(uStack_6f == 0x8e);
    auVar82[10] = -(uStack_6e == 0x8e);
    auVar82[0xb] = -(uStack_6d == 0x8e);
    auVar82[0xc] = -(uStack_6c == 0x8e);
    auVar82[0xd] = -(uStack_6b == 0x8e);
    auVar82[0xe] = -(uStack_6a == 0x8e);
    auVar82[0xf] = -(bStack_69 == 0x8e);
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar82 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar82 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar82 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar82 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar82 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar82 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar82 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar82 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar82 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar82 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar82 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar82 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar82 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar82 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar82 >> 0x77,0) & 1) << 0xe); uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      iVar53 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
        }
      }
      if (*(int *)((long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 0x39) {
        lVar63 = (long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
        goto LAB_002d1fc4;
      }
    }
    if ((bStack_69 & 0x40) == 0) break;
    lVar63 = uVar64 + uVar62;
    uVar62 = uVar62 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar62 <= uVar59);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,(arrays_type *)this_00,uVar54,0x3a5a1a4d5795a08e,&local_3d9,
               (SyntaxKind *)&local_3d8);
    psVar1 = &(this->knownTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    local_3d8._M_len._0_4_ = uVar32;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0x3a5a1a4d5795a08e,&local_3d9,(SyntaxKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d1fc4:
  *(Type **)(lVar63 + 8) = pTVar8;
  pTVar8 = this->bitType;
  local_3d8._M_len._0_4_ = 0x36;
  uVar32 = (undefined4)local_3d8._M_len;
  local_3d8._M_len._0_4_ = 0x36;
  uVar54 = 0x5fb3ad20d9b62c4f >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar7 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar59 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar62 = 0;
  uVar64 = uVar54;
  do {
    pgVar2 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar64;
    local_88 = pgVar2->m[0].n;
    uStack_87 = pgVar2->m[1].n;
    uStack_86 = pgVar2->m[2].n;
    uStack_85 = pgVar2->m[3].n;
    uStack_84 = pgVar2->m[4].n;
    uStack_83 = pgVar2->m[5].n;
    uStack_82 = pgVar2->m[6].n;
    uStack_81 = pgVar2->m[7].n;
    uStack_80 = pgVar2->m[8].n;
    uStack_7f = pgVar2->m[9].n;
    uStack_7e = pgVar2->m[10].n;
    uStack_7d = pgVar2->m[0xb].n;
    uStack_7c = pgVar2->m[0xc].n;
    uStack_7b = pgVar2->m[0xd].n;
    uStack_7a = pgVar2->m[0xe].n;
    uStack_79 = pgVar2->m[0xf].n;
    auVar83[0] = -(local_88 == 'O');
    auVar83[1] = -(uStack_87 == 'O');
    auVar83[2] = -(uStack_86 == 'O');
    auVar83[3] = -(uStack_85 == 'O');
    auVar83[4] = -(uStack_84 == 'O');
    auVar83[5] = -(uStack_83 == 'O');
    auVar83[6] = -(uStack_82 == 'O');
    auVar83[7] = -(uStack_81 == 'O');
    auVar83[8] = -(uStack_80 == 'O');
    auVar83[9] = -(uStack_7f == 'O');
    auVar83[10] = -(uStack_7e == 'O');
    auVar83[0xb] = -(uStack_7d == 'O');
    auVar83[0xc] = -(uStack_7c == 'O');
    auVar83[0xd] = -(uStack_7b == 'O');
    auVar83[0xe] = -(uStack_7a == 'O');
    auVar83[0xf] = -(uStack_79 == 'O');
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar83 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar83 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar83 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar83 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar83 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar83 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar83 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar83 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar83 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar83 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar83 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar83 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar83 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar83 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar83 >> 0x77,0) & 1) << 0xe); uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      iVar53 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
        }
      }
      if (*(int *)((long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 0x36) {
        lVar63 = (long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
        goto LAB_002d20d1;
      }
    }
    if (-1 < (char)uStack_79) break;
    lVar63 = uVar64 + uVar62;
    uVar62 = uVar62 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar62 <= uVar59);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,(arrays_type *)this_00,uVar54,0x5fb3ad20d9b62c4f,&local_3d9,
               (SyntaxKind *)&local_3d8);
    psVar1 = &(this->knownTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    local_3d8._M_len._0_4_ = uVar32;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0x5fb3ad20d9b62c4f,&local_3d9,(SyntaxKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d20d1:
  *(Type **)(lVar63 + 8) = pTVar8;
  pTVar8 = this->logicType;
  local_3d8._M_len._0_4_ = 0x114;
  uVar32 = (undefined4)local_3d8._M_len;
  local_3d8._M_len._0_4_ = 0x114;
  uVar54 = 0x93cf3bfd3c4dc60e >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar7 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar59 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar62 = 0;
  uVar64 = uVar54;
  do {
    pgVar2 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar64;
    local_98 = pgVar2->m[0].n;
    uStack_97 = pgVar2->m[1].n;
    uStack_96 = pgVar2->m[2].n;
    uStack_95 = pgVar2->m[3].n;
    uStack_94 = pgVar2->m[4].n;
    uStack_93 = pgVar2->m[5].n;
    uStack_92 = pgVar2->m[6].n;
    uStack_91 = pgVar2->m[7].n;
    uStack_90 = pgVar2->m[8].n;
    uStack_8f = pgVar2->m[9].n;
    uStack_8e = pgVar2->m[10].n;
    uStack_8d = pgVar2->m[0xb].n;
    uStack_8c = pgVar2->m[0xc].n;
    uStack_8b = pgVar2->m[0xd].n;
    uStack_8a = pgVar2->m[0xe].n;
    bStack_89 = pgVar2->m[0xf].n;
    auVar68[0] = -(local_98 == '\x0e');
    auVar68[1] = -(uStack_97 == '\x0e');
    auVar68[2] = -(uStack_96 == '\x0e');
    auVar68[3] = -(uStack_95 == '\x0e');
    auVar68[4] = -(uStack_94 == '\x0e');
    auVar68[5] = -(uStack_93 == '\x0e');
    auVar68[6] = -(uStack_92 == '\x0e');
    auVar68[7] = -(uStack_91 == '\x0e');
    auVar68[8] = -(uStack_90 == '\x0e');
    auVar68[9] = -(uStack_8f == '\x0e');
    auVar68[10] = -(uStack_8e == '\x0e');
    auVar68[0xb] = -(uStack_8d == '\x0e');
    auVar68[0xc] = -(uStack_8c == '\x0e');
    auVar68[0xd] = -(uStack_8b == '\x0e');
    auVar68[0xe] = -(uStack_8a == '\x0e');
    auVar68[0xf] = -(bStack_89 == 0xe);
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar68 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar68 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar68 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar68 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar68 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar68 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar68 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar68 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar68 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar68 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar68 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar68 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar68 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar68 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar68 >> 0x77,0) & 1) << 0xe); uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      iVar53 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
        }
      }
      if (*(int *)((long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 0x114) {
        lVar63 = (long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
        goto LAB_002d21ee;
      }
    }
    if ((bStack_89 & 0x40) == 0) break;
    lVar63 = uVar64 + uVar62;
    uVar62 = uVar62 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar62 <= uVar59);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,(arrays_type *)this_00,uVar54,0x93cf3bfd3c4dc60e,&local_3d9,
               (SyntaxKind *)&local_3d8);
    psVar1 = &(this->knownTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    local_3d8._M_len._0_4_ = uVar32;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0x93cf3bfd3c4dc60e,&local_3d9,(SyntaxKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d21ee:
  *(Type **)(lVar63 + 8) = pTVar8;
  local_3d8._M_len._0_4_ = 400;
  uVar32 = (undefined4)local_3d8._M_len;
  local_3d8._M_len._0_4_ = 400;
  uVar54 = 0x36ae31d6e461e027 >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar7 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar59 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar62 = 0;
  uVar64 = uVar54;
  do {
    pgVar2 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar64;
    local_a8 = pgVar2->m[0].n;
    uStack_a7 = pgVar2->m[1].n;
    uStack_a6 = pgVar2->m[2].n;
    uStack_a5 = pgVar2->m[3].n;
    uStack_a4 = pgVar2->m[4].n;
    uStack_a3 = pgVar2->m[5].n;
    uStack_a2 = pgVar2->m[6].n;
    uStack_a1 = pgVar2->m[7].n;
    uStack_a0 = pgVar2->m[8].n;
    uStack_9f = pgVar2->m[9].n;
    uStack_9e = pgVar2->m[10].n;
    uStack_9d = pgVar2->m[0xb].n;
    uStack_9c = pgVar2->m[0xc].n;
    uStack_9b = pgVar2->m[0xd].n;
    uStack_9a = pgVar2->m[0xe].n;
    uStack_99 = pgVar2->m[0xf].n;
    auVar84[0] = -(local_a8 == '\'');
    auVar84[1] = -(uStack_a7 == '\'');
    auVar84[2] = -(uStack_a6 == '\'');
    auVar84[3] = -(uStack_a5 == '\'');
    auVar84[4] = -(uStack_a4 == '\'');
    auVar84[5] = -(uStack_a3 == '\'');
    auVar84[6] = -(uStack_a2 == '\'');
    auVar84[7] = -(uStack_a1 == '\'');
    auVar84[8] = -(uStack_a0 == '\'');
    auVar84[9] = -(uStack_9f == '\'');
    auVar84[10] = -(uStack_9e == '\'');
    auVar84[0xb] = -(uStack_9d == '\'');
    auVar84[0xc] = -(uStack_9c == '\'');
    auVar84[0xd] = -(uStack_9b == '\'');
    auVar84[0xe] = -(uStack_9a == '\'');
    auVar84[0xf] = -(uStack_99 == '\'');
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar84 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar84 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar84 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar84 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar84 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar84 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar84 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar84 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar84 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar84 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar84 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar84 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar84 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar84 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar84 >> 0x77,0) & 1) << 0xe); uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      iVar53 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
        }
      }
      if (*(int *)((long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 400) {
        lVar63 = (long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
        goto LAB_002d22f7;
      }
    }
    if (-1 < (char)uStack_99) break;
    lVar63 = uVar64 + uVar62;
    uVar62 = uVar62 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar62 <= uVar59);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,(arrays_type *)this_00,uVar54,0x36ae31d6e461e027,&local_3d9,
               (SyntaxKind *)&local_3d8);
    psVar1 = &(this->knownTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    local_3d8._M_len._0_4_ = uVar32;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0x36ae31d6e461e027,&local_3d9,(SyntaxKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d22f7:
  *(undefined8 *)(lVar63 + 8) = 0x5f4d60;
  pTVar8 = this->integerType;
  local_3d8._M_len._0_4_ = 0x101;
  uVar32 = (undefined4)local_3d8._M_len;
  local_3d8._M_len._0_4_ = 0x101;
  uVar54 = 0xd5b13338c9c6918b >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar7 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar59 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar62 = 0;
  uVar64 = uVar54;
  do {
    pgVar2 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar64;
    local_b8 = pgVar2->m[0].n;
    uStack_b7 = pgVar2->m[1].n;
    uStack_b6 = pgVar2->m[2].n;
    uStack_b5 = pgVar2->m[3].n;
    uStack_b4 = pgVar2->m[4].n;
    uStack_b3 = pgVar2->m[5].n;
    uStack_b2 = pgVar2->m[6].n;
    uStack_b1 = pgVar2->m[7].n;
    uStack_b0 = pgVar2->m[8].n;
    uStack_af = pgVar2->m[9].n;
    uStack_ae = pgVar2->m[10].n;
    uStack_ad = pgVar2->m[0xb].n;
    uStack_ac = pgVar2->m[0xc].n;
    uStack_ab = pgVar2->m[0xd].n;
    uStack_aa = pgVar2->m[0xe].n;
    bStack_a9 = pgVar2->m[0xf].n;
    auVar85[0] = -(local_b8 == 0x8b);
    auVar85[1] = -(uStack_b7 == 0x8b);
    auVar85[2] = -(uStack_b6 == 0x8b);
    auVar85[3] = -(uStack_b5 == 0x8b);
    auVar85[4] = -(uStack_b4 == 0x8b);
    auVar85[5] = -(uStack_b3 == 0x8b);
    auVar85[6] = -(uStack_b2 == 0x8b);
    auVar85[7] = -(uStack_b1 == 0x8b);
    auVar85[8] = -(uStack_b0 == 0x8b);
    auVar85[9] = -(uStack_af == 0x8b);
    auVar85[10] = -(uStack_ae == 0x8b);
    auVar85[0xb] = -(uStack_ad == 0x8b);
    auVar85[0xc] = -(uStack_ac == 0x8b);
    auVar85[0xd] = -(uStack_ab == 0x8b);
    auVar85[0xe] = -(uStack_aa == 0x8b);
    auVar85[0xf] = -(bStack_a9 == 0x8b);
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar85 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar85 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar85 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar85 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar85 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar85 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar85 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar85 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar85 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar85 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar85 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar85 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar85 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar85 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar85 >> 0x77,0) & 1) << 0xe); uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      iVar53 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
        }
      }
      if (*(int *)((long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 0x101) {
        lVar63 = (long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
        goto LAB_002d240f;
      }
    }
    if ((bStack_a9 & 8) == 0) break;
    lVar63 = uVar64 + uVar62;
    uVar62 = uVar62 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar62 <= uVar59);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,(arrays_type *)this_00,uVar54,0xd5b13338c9c6918b,&local_3d9,
               (SyntaxKind *)&local_3d8);
    psVar1 = &(this->knownTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    local_3d8._M_len._0_4_ = uVar32;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0xd5b13338c9c6918b,&local_3d9,(SyntaxKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d240f:
  *(Type **)(lVar63 + 8) = pTVar8;
  local_3d8._M_len._0_4_ = 0x1d0;
  uVar32 = (undefined4)local_3d8._M_len;
  local_3d8._M_len._0_4_ = 0x1d0;
  uVar54 = 0xc48ca036b700e70e >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar7 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar59 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar62 = 0;
  uVar64 = uVar54;
  do {
    pgVar2 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar64;
    local_c8 = pgVar2->m[0].n;
    uStack_c7 = pgVar2->m[1].n;
    uStack_c6 = pgVar2->m[2].n;
    uStack_c5 = pgVar2->m[3].n;
    uStack_c4 = pgVar2->m[4].n;
    uStack_c3 = pgVar2->m[5].n;
    uStack_c2 = pgVar2->m[6].n;
    uStack_c1 = pgVar2->m[7].n;
    uStack_c0 = pgVar2->m[8].n;
    uStack_bf = pgVar2->m[9].n;
    uStack_be = pgVar2->m[10].n;
    uStack_bd = pgVar2->m[0xb].n;
    uStack_bc = pgVar2->m[0xc].n;
    uStack_bb = pgVar2->m[0xd].n;
    uStack_ba = pgVar2->m[0xe].n;
    bStack_b9 = pgVar2->m[0xf].n;
    auVar69[0] = -(local_c8 == '\x0e');
    auVar69[1] = -(uStack_c7 == '\x0e');
    auVar69[2] = -(uStack_c6 == '\x0e');
    auVar69[3] = -(uStack_c5 == '\x0e');
    auVar69[4] = -(uStack_c4 == '\x0e');
    auVar69[5] = -(uStack_c3 == '\x0e');
    auVar69[6] = -(uStack_c2 == '\x0e');
    auVar69[7] = -(uStack_c1 == '\x0e');
    auVar69[8] = -(uStack_c0 == '\x0e');
    auVar69[9] = -(uStack_bf == '\x0e');
    auVar69[10] = -(uStack_be == '\x0e');
    auVar69[0xb] = -(uStack_bd == '\x0e');
    auVar69[0xc] = -(uStack_bc == '\x0e');
    auVar69[0xd] = -(uStack_bb == '\x0e');
    auVar69[0xe] = -(uStack_ba == '\x0e');
    auVar69[0xf] = -(bStack_b9 == 0xe);
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar69 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar69 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar69 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar69 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar69 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar69 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar69 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar69 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar69 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar69 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar69 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar69 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar69 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar69 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar69 >> 0x77,0) & 1) << 0xe); uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      iVar53 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
        }
      }
      if (*(int *)((long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 0x1d0) {
        lVar63 = (long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
        goto LAB_002d2515;
      }
    }
    if ((bStack_b9 & 0x40) == 0) break;
    lVar63 = uVar64 + uVar62;
    uVar62 = uVar62 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar62 <= uVar59);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,(arrays_type *)this_00,uVar54,0xc48ca036b700e70e,&local_3d9,
               (SyntaxKind *)&local_3d8);
    psVar1 = &(this->knownTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    local_3d8._M_len._0_4_ = uVar32;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0xc48ca036b700e70e,&local_3d9,(SyntaxKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d2515:
  *(undefined8 *)(lVar63 + 8) = 0x5f5128;
  pTVar8 = this->realType;
  local_3d8._M_len._0_4_ = 399;
  uVar32 = (undefined4)local_3d8._M_len;
  local_3d8._M_len._0_4_ = 399;
  uVar54 = 0x9876b81d6517644d >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar7 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar59 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar62 = 0;
  uVar64 = uVar54;
  do {
    pgVar2 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar64;
    local_d8 = pgVar2->m[0].n;
    uStack_d7 = pgVar2->m[1].n;
    uStack_d6 = pgVar2->m[2].n;
    uStack_d5 = pgVar2->m[3].n;
    uStack_d4 = pgVar2->m[4].n;
    uStack_d3 = pgVar2->m[5].n;
    uStack_d2 = pgVar2->m[6].n;
    uStack_d1 = pgVar2->m[7].n;
    uStack_d0 = pgVar2->m[8].n;
    uStack_cf = pgVar2->m[9].n;
    uStack_ce = pgVar2->m[10].n;
    uStack_cd = pgVar2->m[0xb].n;
    uStack_cc = pgVar2->m[0xc].n;
    uStack_cb = pgVar2->m[0xd].n;
    uStack_ca = pgVar2->m[0xe].n;
    bStack_c9 = pgVar2->m[0xf].n;
    auVar86[0] = -(local_d8 == 'M');
    auVar86[1] = -(uStack_d7 == 'M');
    auVar86[2] = -(uStack_d6 == 'M');
    auVar86[3] = -(uStack_d5 == 'M');
    auVar86[4] = -(uStack_d4 == 'M');
    auVar86[5] = -(uStack_d3 == 'M');
    auVar86[6] = -(uStack_d2 == 'M');
    auVar86[7] = -(uStack_d1 == 'M');
    auVar86[8] = -(uStack_d0 == 'M');
    auVar86[9] = -(uStack_cf == 'M');
    auVar86[10] = -(uStack_ce == 'M');
    auVar86[0xb] = -(uStack_cd == 'M');
    auVar86[0xc] = -(uStack_cc == 'M');
    auVar86[0xd] = -(uStack_cb == 'M');
    auVar86[0xe] = -(uStack_ca == 'M');
    auVar86[0xf] = -(bStack_c9 == 0x4d);
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar86 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar86 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar86 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar86 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar86 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar86 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar86 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar86 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar86 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar86 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar86 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar86 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar86 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar86 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar86 >> 0x77,0) & 1) << 0xe); uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      iVar53 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
        }
      }
      if (*(int *)((long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 399) {
        lVar63 = (long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
        goto LAB_002d262d;
      }
    }
    if ((bStack_c9 & 0x20) == 0) break;
    lVar63 = uVar64 + uVar62;
    uVar62 = uVar62 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar62 <= uVar59);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,(arrays_type *)this_00,uVar54,0x9876b81d6517644d,&local_3d9,
               (SyntaxKind *)&local_3d8);
    psVar1 = &(this->knownTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    local_3d8._M_len._0_4_ = uVar32;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0x9876b81d6517644d,&local_3d9,(SyntaxKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d262d:
  *(Type **)(lVar63 + 8) = pTVar8;
  local_3d8._M_len._0_4_ = 0x18e;
  uVar32 = (undefined4)local_3d8._M_len;
  local_3d8._M_len._0_4_ = 0x18e;
  uVar54 = 0xfa3f3e63e5cce853 >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar7 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar59 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar62 = 0;
  uVar64 = uVar54;
  do {
    pgVar2 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar64;
    local_e8 = pgVar2->m[0].n;
    uStack_e7 = pgVar2->m[1].n;
    uStack_e6 = pgVar2->m[2].n;
    uStack_e5 = pgVar2->m[3].n;
    uStack_e4 = pgVar2->m[4].n;
    uStack_e3 = pgVar2->m[5].n;
    uStack_e2 = pgVar2->m[6].n;
    uStack_e1 = pgVar2->m[7].n;
    uStack_e0 = pgVar2->m[8].n;
    uStack_df = pgVar2->m[9].n;
    uStack_de = pgVar2->m[10].n;
    uStack_dd = pgVar2->m[0xb].n;
    uStack_dc = pgVar2->m[0xc].n;
    uStack_db = pgVar2->m[0xd].n;
    uStack_da = pgVar2->m[0xe].n;
    bStack_d9 = pgVar2->m[0xf].n;
    auVar87[0] = -(local_e8 == 'S');
    auVar87[1] = -(uStack_e7 == 'S');
    auVar87[2] = -(uStack_e6 == 'S');
    auVar87[3] = -(uStack_e5 == 'S');
    auVar87[4] = -(uStack_e4 == 'S');
    auVar87[5] = -(uStack_e3 == 'S');
    auVar87[6] = -(uStack_e2 == 'S');
    auVar87[7] = -(uStack_e1 == 'S');
    auVar87[8] = -(uStack_e0 == 'S');
    auVar87[9] = -(uStack_df == 'S');
    auVar87[10] = -(uStack_de == 'S');
    auVar87[0xb] = -(uStack_dd == 'S');
    auVar87[0xc] = -(uStack_dc == 'S');
    auVar87[0xd] = -(uStack_db == 'S');
    auVar87[0xe] = -(uStack_da == 'S');
    auVar87[0xf] = -(bStack_d9 == 0x53);
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar87 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar87 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar87 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar87 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar87 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar87 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar87 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar87 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar87 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar87 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar87 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar87 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar87 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar87 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar87 >> 0x77,0) & 1) << 0xe); uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      iVar53 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
        }
      }
      if (*(int *)((long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 0x18e) {
        lVar63 = (long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
        goto LAB_002d2737;
      }
    }
    if ((bStack_d9 & 8) == 0) break;
    lVar63 = uVar64 + uVar62;
    uVar62 = uVar62 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar62 <= uVar59);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,(arrays_type *)this_00,uVar54,0xfa3f3e63e5cce853,&local_3d9,
               (SyntaxKind *)&local_3d8);
    psVar1 = &(this->knownTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    local_3d8._M_len._0_4_ = uVar32;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0xfa3f3e63e5cce853,&local_3d9,(SyntaxKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d2737:
  *(undefined8 *)(lVar63 + 8) = 0x5f5220;
  pTVar8 = this->shortRealType;
  local_3d8._M_len._0_4_ = 0x1a8;
  uVar32 = (undefined4)local_3d8._M_len;
  local_3d8._M_len._0_4_ = 0x1a8;
  uVar54 = 0xbe19b3ad35d83ce >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar7 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar59 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar62 = 0;
  uVar64 = uVar54;
  do {
    pgVar2 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar64;
    local_f8 = pgVar2->m[0].n;
    uStack_f7 = pgVar2->m[1].n;
    uStack_f6 = pgVar2->m[2].n;
    uStack_f5 = pgVar2->m[3].n;
    uStack_f4 = pgVar2->m[4].n;
    uStack_f3 = pgVar2->m[5].n;
    uStack_f2 = pgVar2->m[6].n;
    uStack_f1 = pgVar2->m[7].n;
    uStack_f0 = pgVar2->m[8].n;
    uStack_ef = pgVar2->m[9].n;
    uStack_ee = pgVar2->m[10].n;
    uStack_ed = pgVar2->m[0xb].n;
    uStack_ec = pgVar2->m[0xc].n;
    uStack_eb = pgVar2->m[0xd].n;
    uStack_ea = pgVar2->m[0xe].n;
    bStack_e9 = pgVar2->m[0xf].n;
    auVar88[0] = -(local_f8 == 0xce);
    auVar88[1] = -(uStack_f7 == 0xce);
    auVar88[2] = -(uStack_f6 == 0xce);
    auVar88[3] = -(uStack_f5 == 0xce);
    auVar88[4] = -(uStack_f4 == 0xce);
    auVar88[5] = -(uStack_f3 == 0xce);
    auVar88[6] = -(uStack_f2 == 0xce);
    auVar88[7] = -(uStack_f1 == 0xce);
    auVar88[8] = -(uStack_f0 == 0xce);
    auVar88[9] = -(uStack_ef == 0xce);
    auVar88[10] = -(uStack_ee == 0xce);
    auVar88[0xb] = -(uStack_ed == 0xce);
    auVar88[0xc] = -(uStack_ec == 0xce);
    auVar88[0xd] = -(uStack_eb == 0xce);
    auVar88[0xe] = -(uStack_ea == 0xce);
    auVar88[0xf] = -(bStack_e9 == 0xce);
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar88 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar88 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar88 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar88 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar88 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar88 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar88 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar88 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar88 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar88 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar88 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar88 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar88 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar88 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar88 >> 0x77,0) & 1) << 0xe); uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      iVar53 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
        }
      }
      if (*(int *)((long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 0x1a8) {
        lVar63 = (long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
        goto LAB_002d284f;
      }
    }
    if ((bStack_e9 & 0x40) == 0) break;
    lVar63 = uVar64 + uVar62;
    uVar62 = uVar62 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar62 <= uVar59);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,(arrays_type *)this_00,uVar54,0xbe19b3ad35d83ce,&local_3d9,
               (SyntaxKind *)&local_3d8);
    psVar1 = &(this->knownTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    local_3d8._M_len._0_4_ = uVar32;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0xbe19b3ad35d83ce,&local_3d9,(SyntaxKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d284f:
  *(Type **)(lVar63 + 8) = pTVar8;
  pTVar8 = this->stringType;
  local_3d8._M_len._0_4_ = 0x1bd;
  uVar32 = (undefined4)local_3d8._M_len;
  local_3d8._M_len._0_4_ = 0x1bd;
  uVar54 = 0x66e97724479b192 >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar7 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar59 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar62 = 0;
  uVar64 = uVar54;
  do {
    pgVar2 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar64;
    local_108 = pgVar2->m[0].n;
    uStack_107 = pgVar2->m[1].n;
    uStack_106 = pgVar2->m[2].n;
    uStack_105 = pgVar2->m[3].n;
    uStack_104 = pgVar2->m[4].n;
    uStack_103 = pgVar2->m[5].n;
    uStack_102 = pgVar2->m[6].n;
    uStack_101 = pgVar2->m[7].n;
    uStack_100 = pgVar2->m[8].n;
    uStack_ff = pgVar2->m[9].n;
    uStack_fe = pgVar2->m[10].n;
    uStack_fd = pgVar2->m[0xb].n;
    uStack_fc = pgVar2->m[0xc].n;
    uStack_fb = pgVar2->m[0xd].n;
    uStack_fa = pgVar2->m[0xe].n;
    bStack_f9 = pgVar2->m[0xf].n;
    auVar70[0] = -(local_108 == 0x92);
    auVar70[1] = -(uStack_107 == 0x92);
    auVar70[2] = -(uStack_106 == 0x92);
    auVar70[3] = -(uStack_105 == 0x92);
    auVar70[4] = -(uStack_104 == 0x92);
    auVar70[5] = -(uStack_103 == 0x92);
    auVar70[6] = -(uStack_102 == 0x92);
    auVar70[7] = -(uStack_101 == 0x92);
    auVar70[8] = -(uStack_100 == 0x92);
    auVar70[9] = -(uStack_ff == 0x92);
    auVar70[10] = -(uStack_fe == 0x92);
    auVar70[0xb] = -(uStack_fd == 0x92);
    auVar70[0xc] = -(uStack_fc == 0x92);
    auVar70[0xd] = -(uStack_fb == 0x92);
    auVar70[0xe] = -(uStack_fa == 0x92);
    auVar70[0xf] = -(bStack_f9 == 0x92);
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar70 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar70 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar70 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar70 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar70 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar70 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar70 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar70 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar70 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar70 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar70 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar70 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar70 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar70 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar70 >> 0x77,0) & 1) << 0xe); uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      iVar53 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
        }
      }
      if (*(int *)((long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 0x1bd) {
        lVar63 = (long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
        goto LAB_002d296c;
      }
    }
    if ((bStack_f9 & 4) == 0) break;
    lVar63 = uVar64 + uVar62;
    uVar62 = uVar62 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar62 <= uVar59);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,(arrays_type *)this_00,uVar54,0x66e97724479b192,&local_3d9,
               (SyntaxKind *)&local_3d8);
    psVar1 = &(this->knownTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    local_3d8._M_len._0_4_ = uVar32;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0x66e97724479b192,&local_3d9,(SyntaxKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d296c:
  *(Type **)(lVar63 + 8) = pTVar8;
  local_3d8._M_len._0_4_ = 0x3a;
  uVar32 = (undefined4)local_3d8._M_len;
  local_3d8._M_len._0_4_ = 0x3a;
  uVar54 = 0xd8919406d6e01ce1 >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar7 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar59 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar62 = 0;
  uVar64 = uVar54;
  do {
    pgVar2 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar64;
    local_118 = pgVar2->m[0].n;
    uStack_117 = pgVar2->m[1].n;
    uStack_116 = pgVar2->m[2].n;
    uStack_115 = pgVar2->m[3].n;
    uStack_114 = pgVar2->m[4].n;
    uStack_113 = pgVar2->m[5].n;
    uStack_112 = pgVar2->m[6].n;
    uStack_111 = pgVar2->m[7].n;
    uStack_110 = pgVar2->m[8].n;
    uStack_10f = pgVar2->m[9].n;
    uStack_10e = pgVar2->m[10].n;
    uStack_10d = pgVar2->m[0xb].n;
    uStack_10c = pgVar2->m[0xc].n;
    uStack_10b = pgVar2->m[0xd].n;
    uStack_10a = pgVar2->m[0xe].n;
    bStack_109 = pgVar2->m[0xf].n;
    auVar89[0] = -(local_118 == 0xe1);
    auVar89[1] = -(uStack_117 == 0xe1);
    auVar89[2] = -(uStack_116 == 0xe1);
    auVar89[3] = -(uStack_115 == 0xe1);
    auVar89[4] = -(uStack_114 == 0xe1);
    auVar89[5] = -(uStack_113 == 0xe1);
    auVar89[6] = -(uStack_112 == 0xe1);
    auVar89[7] = -(uStack_111 == 0xe1);
    auVar89[8] = -(uStack_110 == 0xe1);
    auVar89[9] = -(uStack_10f == 0xe1);
    auVar89[10] = -(uStack_10e == 0xe1);
    auVar89[0xb] = -(uStack_10d == 0xe1);
    auVar89[0xc] = -(uStack_10c == 0xe1);
    auVar89[0xd] = -(uStack_10b == 0xe1);
    auVar89[0xe] = -(uStack_10a == 0xe1);
    auVar89[0xf] = -(bStack_109 == 0xe1);
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar89 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar89 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar89 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar89 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar89 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar89 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar89 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar89 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar89 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar89 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar89 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar89 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar89 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar89 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar89 >> 0x77,0) & 1) << 0xe); uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      iVar53 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
        }
      }
      if (*(int *)((long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 0x3a) {
        lVar63 = (long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
        goto LAB_002d2a73;
      }
    }
    if ((bStack_109 & 2) == 0) break;
    lVar63 = uVar64 + uVar62;
    uVar62 = uVar62 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar62 <= uVar59);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,(arrays_type *)this_00,uVar54,0xd8919406d6e01ce1,&local_3d9,
               (SyntaxKind *)&local_3d8);
    psVar1 = &(this->knownTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    local_3d8._M_len._0_4_ = uVar32;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0xd8919406d6e01ce1,&local_3d9,(SyntaxKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d2a73:
  *(undefined8 *)(lVar63 + 8) = 0x5f5300;
  local_3d8._M_len._0_4_ = 0x14d;
  uVar32 = (undefined4)local_3d8._M_len;
  local_3d8._M_len._0_4_ = 0x14d;
  uVar54 = 0xce29564a93e3679c >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar7 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar59 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar62 = 0;
  uVar64 = uVar54;
  do {
    pgVar2 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar64;
    local_128 = pgVar2->m[0].n;
    uStack_127 = pgVar2->m[1].n;
    uStack_126 = pgVar2->m[2].n;
    uStack_125 = pgVar2->m[3].n;
    uStack_124 = pgVar2->m[4].n;
    uStack_123 = pgVar2->m[5].n;
    uStack_122 = pgVar2->m[6].n;
    uStack_121 = pgVar2->m[7].n;
    uStack_120 = pgVar2->m[8].n;
    uStack_11f = pgVar2->m[9].n;
    uStack_11e = pgVar2->m[10].n;
    uStack_11d = pgVar2->m[0xb].n;
    uStack_11c = pgVar2->m[0xc].n;
    uStack_11b = pgVar2->m[0xd].n;
    uStack_11a = pgVar2->m[0xe].n;
    bStack_119 = pgVar2->m[0xf].n;
    auVar90[0] = -(local_128 == 0x9c);
    auVar90[1] = -(uStack_127 == 0x9c);
    auVar90[2] = -(uStack_126 == 0x9c);
    auVar90[3] = -(uStack_125 == 0x9c);
    auVar90[4] = -(uStack_124 == 0x9c);
    auVar90[5] = -(uStack_123 == 0x9c);
    auVar90[6] = -(uStack_122 == 0x9c);
    auVar90[7] = -(uStack_121 == 0x9c);
    auVar90[8] = -(uStack_120 == 0x9c);
    auVar90[9] = -(uStack_11f == 0x9c);
    auVar90[10] = -(uStack_11e == 0x9c);
    auVar90[0xb] = -(uStack_11d == 0x9c);
    auVar90[0xc] = -(uStack_11c == 0x9c);
    auVar90[0xd] = -(uStack_11b == 0x9c);
    auVar90[0xe] = -(uStack_11a == 0x9c);
    auVar90[0xf] = -(bStack_119 == 0x9c);
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar90 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar90 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar90 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar90 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar90 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar90 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar90 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar90 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar90 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar90 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar90 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar90 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar90 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar90 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar90 >> 0x77,0) & 1) << 0xe); uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      iVar53 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
        }
      }
      if (*(int *)((long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 0x14d) {
        lVar63 = (long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
        goto LAB_002d2b84;
      }
    }
    if ((bStack_119 & 0x10) == 0) break;
    lVar63 = uVar64 + uVar62;
    uVar62 = uVar62 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar62 <= uVar59);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,(arrays_type *)this_00,uVar54,0xce29564a93e3679c,&local_3d9,
               (SyntaxKind *)&local_3d8);
    psVar1 = &(this->knownTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    local_3d8._M_len._0_4_ = uVar32;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0xce29564a93e3679c,&local_3d9,(SyntaxKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d2b84:
  *(undefined8 *)(lVar63 + 8) = 0x5f5348;
  pTVar8 = this->voidType;
  local_3d8._M_len._0_4_ = 0x207;
  uVar32 = (undefined4)local_3d8._M_len;
  local_3d8._M_len._0_4_ = 0x207;
  uVar54 = 0xc277c71110018fd3 >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar7 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar59 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar62 = 0;
  uVar64 = uVar54;
  do {
    pgVar2 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar64;
    local_138 = pgVar2->m[0].n;
    uStack_137 = pgVar2->m[1].n;
    uStack_136 = pgVar2->m[2].n;
    uStack_135 = pgVar2->m[3].n;
    uStack_134 = pgVar2->m[4].n;
    uStack_133 = pgVar2->m[5].n;
    uStack_132 = pgVar2->m[6].n;
    uStack_131 = pgVar2->m[7].n;
    uStack_130 = pgVar2->m[8].n;
    uStack_12f = pgVar2->m[9].n;
    uStack_12e = pgVar2->m[10].n;
    uStack_12d = pgVar2->m[0xb].n;
    uStack_12c = pgVar2->m[0xc].n;
    uStack_12b = pgVar2->m[0xd].n;
    uStack_12a = pgVar2->m[0xe].n;
    bStack_129 = pgVar2->m[0xf].n;
    auVar91[0] = -(local_138 == 0xd3);
    auVar91[1] = -(uStack_137 == 0xd3);
    auVar91[2] = -(uStack_136 == 0xd3);
    auVar91[3] = -(uStack_135 == 0xd3);
    auVar91[4] = -(uStack_134 == 0xd3);
    auVar91[5] = -(uStack_133 == 0xd3);
    auVar91[6] = -(uStack_132 == 0xd3);
    auVar91[7] = -(uStack_131 == 0xd3);
    auVar91[8] = -(uStack_130 == 0xd3);
    auVar91[9] = -(uStack_12f == 0xd3);
    auVar91[10] = -(uStack_12e == 0xd3);
    auVar91[0xb] = -(uStack_12d == 0xd3);
    auVar91[0xc] = -(uStack_12c == 0xd3);
    auVar91[0xd] = -(uStack_12b == 0xd3);
    auVar91[0xe] = -(uStack_12a == 0xd3);
    auVar91[0xf] = -(bStack_129 == 0xd3);
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar91 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar91 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar91 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar91 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar91 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar91 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar91 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar91 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar91 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar91 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar91 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar91 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar91 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar91 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar91 >> 0x77,0) & 1) << 0xe); uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      iVar53 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
        }
      }
      if (*(int *)((long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 0x207) {
        lVar63 = (long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
        goto LAB_002d2c9c;
      }
    }
    if ((bStack_129 & 8) == 0) break;
    lVar63 = uVar64 + uVar62;
    uVar62 = uVar62 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar62 <= uVar59);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,(arrays_type *)this_00,uVar54,0xc277c71110018fd3,&local_3d9,
               (SyntaxKind *)&local_3d8);
    psVar1 = &(this->knownTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    local_3d8._M_len._0_4_ = uVar32;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0xc277c71110018fd3,&local_3d9,(SyntaxKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d2c9c:
  *(Type **)(lVar63 + 8) = pTVar8;
  local_3d8._M_len._0_4_ = 0xc0;
  uVar32 = (undefined4)local_3d8._M_len;
  local_3d8._M_len._0_4_ = 0xc0;
  uVar54 = 0xa99b4b1f77dd0fb6 >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar7 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar59 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar62 = 0;
  uVar64 = uVar54;
  do {
    pgVar2 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar64;
    local_148 = pgVar2->m[0].n;
    uStack_147 = pgVar2->m[1].n;
    uStack_146 = pgVar2->m[2].n;
    uStack_145 = pgVar2->m[3].n;
    uStack_144 = pgVar2->m[4].n;
    uStack_143 = pgVar2->m[5].n;
    uStack_142 = pgVar2->m[6].n;
    uStack_141 = pgVar2->m[7].n;
    uStack_140 = pgVar2->m[8].n;
    uStack_13f = pgVar2->m[9].n;
    uStack_13e = pgVar2->m[10].n;
    uStack_13d = pgVar2->m[0xb].n;
    uStack_13c = pgVar2->m[0xc].n;
    uStack_13b = pgVar2->m[0xd].n;
    uStack_13a = pgVar2->m[0xe].n;
    bStack_139 = pgVar2->m[0xf].n;
    auVar71[0] = -(local_148 == 0xb6);
    auVar71[1] = -(uStack_147 == 0xb6);
    auVar71[2] = -(uStack_146 == 0xb6);
    auVar71[3] = -(uStack_145 == 0xb6);
    auVar71[4] = -(uStack_144 == 0xb6);
    auVar71[5] = -(uStack_143 == 0xb6);
    auVar71[6] = -(uStack_142 == 0xb6);
    auVar71[7] = -(uStack_141 == 0xb6);
    auVar71[8] = -(uStack_140 == 0xb6);
    auVar71[9] = -(uStack_13f == 0xb6);
    auVar71[10] = -(uStack_13e == 0xb6);
    auVar71[0xb] = -(uStack_13d == 0xb6);
    auVar71[0xc] = -(uStack_13c == 0xb6);
    auVar71[0xd] = -(uStack_13b == 0xb6);
    auVar71[0xe] = -(uStack_13a == 0xb6);
    auVar71[0xf] = -(bStack_139 == 0xb6);
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar71 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar71 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar71 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar71 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar71 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar71 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar71 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar71 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar71 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar71 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar71 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar71 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar71 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar71 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar71 >> 0x77,0) & 1) << 0xe); uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      iVar53 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
        }
      }
      if (*(int *)((long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 0xc0) {
        lVar63 = (long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
        goto LAB_002d2da2;
      }
    }
    if ((bStack_139 & 0x40) == 0) break;
    lVar63 = uVar64 + uVar62;
    uVar62 = uVar62 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar62 <= uVar59);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,(arrays_type *)this_00,uVar54,0xa99b4b1f77dd0fb6,&local_3d9,
               (SyntaxKind *)&local_3d8);
    psVar1 = &(this->knownTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    local_3d8._M_len._0_4_ = uVar32;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0xa99b4b1f77dd0fb6,&local_3d9,(SyntaxKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d2da2:
  *(undefined8 *)(lVar63 + 8) = 0x5f5390;
  local_3d8._M_len._0_4_ = 0x20e;
  uVar32 = (undefined4)local_3d8._M_len;
  local_3d8._M_len._0_4_ = 0x20e;
  uVar54 = 0x15fc1b238b0af263 >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar7 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar59 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar62 = 0;
  uVar64 = uVar54;
  do {
    pgVar2 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar64;
    local_158 = pgVar2->m[0].n;
    uStack_157 = pgVar2->m[1].n;
    uStack_156 = pgVar2->m[2].n;
    uStack_155 = pgVar2->m[3].n;
    uStack_154 = pgVar2->m[4].n;
    uStack_153 = pgVar2->m[5].n;
    uStack_152 = pgVar2->m[6].n;
    uStack_151 = pgVar2->m[7].n;
    uStack_150 = pgVar2->m[8].n;
    uStack_14f = pgVar2->m[9].n;
    uStack_14e = pgVar2->m[10].n;
    uStack_14d = pgVar2->m[0xb].n;
    uStack_14c = pgVar2->m[0xc].n;
    uStack_14b = pgVar2->m[0xd].n;
    uStack_14a = pgVar2->m[0xe].n;
    bStack_149 = pgVar2->m[0xf].n;
    auVar92[0] = -(local_158 == 'c');
    auVar92[1] = -(uStack_157 == 'c');
    auVar92[2] = -(uStack_156 == 'c');
    auVar92[3] = -(uStack_155 == 'c');
    auVar92[4] = -(uStack_154 == 'c');
    auVar92[5] = -(uStack_153 == 'c');
    auVar92[6] = -(uStack_152 == 'c');
    auVar92[7] = -(uStack_151 == 'c');
    auVar92[8] = -(uStack_150 == 'c');
    auVar92[9] = -(uStack_14f == 'c');
    auVar92[10] = -(uStack_14e == 'c');
    auVar92[0xb] = -(uStack_14d == 'c');
    auVar92[0xc] = -(uStack_14c == 'c');
    auVar92[0xd] = -(uStack_14b == 'c');
    auVar92[0xe] = -(uStack_14a == 'c');
    auVar92[0xf] = -(bStack_149 == 99);
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar92 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar92 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar92 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar92 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar92 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar92 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar92 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar92 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar92 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar92 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar92 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar92 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar92 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar92 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar92 >> 0x77,0) & 1) << 0xe); uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      iVar53 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
        }
      }
      if (*(int *)((long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 0x20e) {
        lVar63 = (long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
        goto LAB_002d2eb3;
      }
    }
    if ((bStack_149 & 8) == 0) break;
    lVar63 = uVar64 + uVar62;
    uVar62 = uVar62 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar62 <= uVar59);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,(arrays_type *)this_00,uVar54,0x15fc1b238b0af263,&local_3d9,
               (SyntaxKind *)&local_3d8);
    psVar1 = &(this->knownTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    local_3d8._M_len._0_4_ = uVar32;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0x15fc1b238b0af263,&local_3d9,(SyntaxKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d2eb3:
  *(undefined8 *)(lVar63 + 8) = 0x5f53d8;
  local_3d8._M_len._0_4_ = 0x1dc;
  uVar32 = (undefined4)local_3d8._M_len;
  local_3d8._M_len._0_4_ = 0x1dc;
  uVar54 = 0x2f2654e8ae7eb62a >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar7 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar59 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar62 = 0;
  uVar64 = uVar54;
  do {
    pgVar2 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar64;
    local_168 = pgVar2->m[0].n;
    uStack_167 = pgVar2->m[1].n;
    uStack_166 = pgVar2->m[2].n;
    uStack_165 = pgVar2->m[3].n;
    uStack_164 = pgVar2->m[4].n;
    uStack_163 = pgVar2->m[5].n;
    uStack_162 = pgVar2->m[6].n;
    uStack_161 = pgVar2->m[7].n;
    uStack_160 = pgVar2->m[8].n;
    uStack_15f = pgVar2->m[9].n;
    uStack_15e = pgVar2->m[10].n;
    uStack_15d = pgVar2->m[0xb].n;
    uStack_15c = pgVar2->m[0xc].n;
    uStack_15b = pgVar2->m[0xd].n;
    uStack_15a = pgVar2->m[0xe].n;
    bStack_159 = pgVar2->m[0xf].n;
    auVar93[0] = -(local_168 == '*');
    auVar93[1] = -(uStack_167 == '*');
    auVar93[2] = -(uStack_166 == '*');
    auVar93[3] = -(uStack_165 == '*');
    auVar93[4] = -(uStack_164 == '*');
    auVar93[5] = -(uStack_163 == '*');
    auVar93[6] = -(uStack_162 == '*');
    auVar93[7] = -(uStack_161 == '*');
    auVar93[8] = -(uStack_160 == '*');
    auVar93[9] = -(uStack_15f == '*');
    auVar93[10] = -(uStack_15e == '*');
    auVar93[0xb] = -(uStack_15d == '*');
    auVar93[0xc] = -(uStack_15c == '*');
    auVar93[0xd] = -(uStack_15b == '*');
    auVar93[0xe] = -(uStack_15a == '*');
    auVar93[0xf] = -(bStack_159 == 0x2a);
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar93 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar93 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar93 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar93 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar93 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar93 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar93 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar93 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar93 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar93 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar93 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar93 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar93 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar93 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar93 >> 0x77,0) & 1) << 0xe); uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      iVar53 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
        }
      }
      if (*(int *)((long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 0x1dc) {
        lVar63 = (long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
        goto LAB_002d2fc4;
      }
    }
    if ((bStack_159 & 4) == 0) break;
    lVar63 = uVar64 + uVar62;
    uVar62 = uVar62 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar62 <= uVar59);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,(arrays_type *)this_00,uVar54,0x2f2654e8ae7eb62a,&local_3d9,
               (SyntaxKind *)&local_3d8);
    psVar1 = &(this->knownTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    local_3d8._M_len._0_4_ = uVar32;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0x2f2654e8ae7eb62a,&local_3d9,(SyntaxKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d2fc4:
  *(undefined8 *)(lVar63 + 8) = 0x5f5420;
  local_3d8._M_len._0_4_ = 0x1ff;
  uVar32 = (undefined4)local_3d8._M_len;
  local_3d8._M_len._0_4_ = 0x1ff;
  uVar54 = 0xd0bbf94515adacd0 >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar7 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar59 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar62 = 0;
  uVar64 = uVar54;
  do {
    pgVar2 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar64;
    local_178 = pgVar2->m[0].n;
    uStack_177 = pgVar2->m[1].n;
    uStack_176 = pgVar2->m[2].n;
    uStack_175 = pgVar2->m[3].n;
    uStack_174 = pgVar2->m[4].n;
    uStack_173 = pgVar2->m[5].n;
    uStack_172 = pgVar2->m[6].n;
    uStack_171 = pgVar2->m[7].n;
    uStack_170 = pgVar2->m[8].n;
    uStack_16f = pgVar2->m[9].n;
    uStack_16e = pgVar2->m[10].n;
    uStack_16d = pgVar2->m[0xb].n;
    uStack_16c = pgVar2->m[0xc].n;
    uStack_16b = pgVar2->m[0xd].n;
    uStack_16a = pgVar2->m[0xe].n;
    bStack_169 = pgVar2->m[0xf].n;
    auVar94[0] = -(local_178 == 0xd0);
    auVar94[1] = -(uStack_177 == 0xd0);
    auVar94[2] = -(uStack_176 == 0xd0);
    auVar94[3] = -(uStack_175 == 0xd0);
    auVar94[4] = -(uStack_174 == 0xd0);
    auVar94[5] = -(uStack_173 == 0xd0);
    auVar94[6] = -(uStack_172 == 0xd0);
    auVar94[7] = -(uStack_171 == 0xd0);
    auVar94[8] = -(uStack_170 == 0xd0);
    auVar94[9] = -(uStack_16f == 0xd0);
    auVar94[10] = -(uStack_16e == 0xd0);
    auVar94[0xb] = -(uStack_16d == 0xd0);
    auVar94[0xc] = -(uStack_16c == 0xd0);
    auVar94[0xd] = -(uStack_16b == 0xd0);
    auVar94[0xe] = -(uStack_16a == 0xd0);
    auVar94[0xf] = -(bStack_169 == 0xd0);
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar94 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar94 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar94 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar94 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar94 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar94 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar94 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar94 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar94 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar94 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar94 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar94 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar94 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar94 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar94 >> 0x77,0) & 1) << 0xe); uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      iVar53 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
        }
      }
      if (*(int *)((long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 0x1ff) {
        lVar63 = (long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
        goto LAB_002d30d5;
      }
    }
    if ((bStack_169 & 1) == 0) break;
    lVar63 = uVar64 + uVar62;
    uVar62 = uVar62 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar62 <= uVar59);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,(arrays_type *)this_00,uVar54,0xd0bbf94515adacd0,&local_3d9,
               (SyntaxKind *)&local_3d8);
    psVar1 = &(this->knownTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    local_3d8._M_len._0_4_ = uVar32;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0xd0bbf94515adacd0,&local_3d9,(SyntaxKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d30d5:
  *(undefined8 *)(lVar63 + 8) = 0x5f5468;
  local_3d8._M_len._0_4_ = 0x1a5;
  uVar32 = (undefined4)local_3d8._M_len;
  local_3d8._M_len._0_4_ = 0x1a5;
  uVar54 = 0x313b2e0e557e0f8d >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar7 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar59 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar62 = 0;
  uVar64 = uVar54;
  do {
    pgVar2 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar64;
    local_188 = pgVar2->m[0].n;
    uStack_187 = pgVar2->m[1].n;
    uStack_186 = pgVar2->m[2].n;
    uStack_185 = pgVar2->m[3].n;
    uStack_184 = pgVar2->m[4].n;
    uStack_183 = pgVar2->m[5].n;
    uStack_182 = pgVar2->m[6].n;
    uStack_181 = pgVar2->m[7].n;
    uStack_180 = pgVar2->m[8].n;
    uStack_17f = pgVar2->m[9].n;
    uStack_17e = pgVar2->m[10].n;
    uStack_17d = pgVar2->m[0xb].n;
    uStack_17c = pgVar2->m[0xc].n;
    uStack_17b = pgVar2->m[0xd].n;
    uStack_17a = pgVar2->m[0xe].n;
    bStack_179 = pgVar2->m[0xf].n;
    auVar95[0] = -(local_188 == 0x8d);
    auVar95[1] = -(uStack_187 == 0x8d);
    auVar95[2] = -(uStack_186 == 0x8d);
    auVar95[3] = -(uStack_185 == 0x8d);
    auVar95[4] = -(uStack_184 == 0x8d);
    auVar95[5] = -(uStack_183 == 0x8d);
    auVar95[6] = -(uStack_182 == 0x8d);
    auVar95[7] = -(uStack_181 == 0x8d);
    auVar95[8] = -(uStack_180 == 0x8d);
    auVar95[9] = -(uStack_17f == 0x8d);
    auVar95[10] = -(uStack_17e == 0x8d);
    auVar95[0xb] = -(uStack_17d == 0x8d);
    auVar95[0xc] = -(uStack_17c == 0x8d);
    auVar95[0xd] = -(uStack_17b == 0x8d);
    auVar95[0xe] = -(uStack_17a == 0x8d);
    auVar95[0xf] = -(bStack_179 == 0x8d);
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar95 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar95 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar95 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar95 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar95 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar95 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar95 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar95 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar95 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar95 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar95 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar95 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar95 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar95 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar95 >> 0x77,0) & 1) << 0xe); uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      iVar53 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
        }
      }
      if (*(int *)((long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 0x1a5) {
        lVar63 = (long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
        goto LAB_002d31e6;
      }
    }
    if ((bStack_179 & 0x20) == 0) break;
    lVar63 = uVar64 + uVar62;
    uVar62 = uVar62 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar62 <= uVar59);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,(arrays_type *)this_00,uVar54,0x313b2e0e557e0f8d,&local_3d9,
               (SyntaxKind *)&local_3d8);
    psVar1 = &(this->knownTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    local_3d8._M_len._0_4_ = uVar32;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0x313b2e0e557e0f8d,&local_3d9,(SyntaxKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d31e6:
  *(undefined8 *)(lVar63 + 8) = 0x5f54b0;
  local_3d8._M_len._0_4_ = 0x180;
  uVar32 = (undefined4)local_3d8._M_len;
  local_3d8._M_len._0_4_ = 0x180;
  uVar54 = 0x5336963eefba1f6d >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar7 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar59 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar62 = 0;
  uVar64 = uVar54;
  do {
    pgVar2 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar64;
    local_198 = pgVar2->m[0].n;
    uStack_197 = pgVar2->m[1].n;
    uStack_196 = pgVar2->m[2].n;
    uStack_195 = pgVar2->m[3].n;
    uStack_194 = pgVar2->m[4].n;
    uStack_193 = pgVar2->m[5].n;
    uStack_192 = pgVar2->m[6].n;
    uStack_191 = pgVar2->m[7].n;
    uStack_190 = pgVar2->m[8].n;
    uStack_18f = pgVar2->m[9].n;
    uStack_18e = pgVar2->m[10].n;
    uStack_18d = pgVar2->m[0xb].n;
    uStack_18c = pgVar2->m[0xc].n;
    uStack_18b = pgVar2->m[0xd].n;
    uStack_18a = pgVar2->m[0xe].n;
    bStack_189 = pgVar2->m[0xf].n;
    auVar96[0] = -(local_198 == 'm');
    auVar96[1] = -(uStack_197 == 'm');
    auVar96[2] = -(uStack_196 == 'm');
    auVar96[3] = -(uStack_195 == 'm');
    auVar96[4] = -(uStack_194 == 'm');
    auVar96[5] = -(uStack_193 == 'm');
    auVar96[6] = -(uStack_192 == 'm');
    auVar96[7] = -(uStack_191 == 'm');
    auVar96[8] = -(uStack_190 == 'm');
    auVar96[9] = -(uStack_18f == 'm');
    auVar96[10] = -(uStack_18e == 'm');
    auVar96[0xb] = -(uStack_18d == 'm');
    auVar96[0xc] = -(uStack_18c == 'm');
    auVar96[0xd] = -(uStack_18b == 'm');
    auVar96[0xe] = -(uStack_18a == 'm');
    auVar96[0xf] = -(bStack_189 == 0x6d);
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar96 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar96 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar96 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar96 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar96 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar96 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar96 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar96 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar96 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar96 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar96 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar96 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar96 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar96 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar96 >> 0x77,0) & 1) << 0xe); uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      iVar53 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
        }
      }
      if (*(int *)((long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 0x180) {
        lVar63 = (long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
        goto LAB_002d32f7;
      }
    }
    if ((bStack_189 & 0x20) == 0) break;
    lVar63 = uVar64 + uVar62;
    uVar62 = uVar62 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar62 <= uVar59);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,(arrays_type *)this_00,uVar54,0x5336963eefba1f6d,&local_3d9,
               (SyntaxKind *)&local_3d8);
    psVar1 = &(this->knownTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    local_3d8._M_len._0_4_ = uVar32;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0x5336963eefba1f6d,&local_3d9,(SyntaxKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d32f7:
  *(undefined8 *)(lVar63 + 8) = 0x5f54f8;
  pTVar8 = this->errorType;
  local_3d8._M_len = (ulong)local_3d8._M_len._4_4_ << 0x20;
  uVar59 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  ppVar7 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar64 = 0;
  uVar54 = 0;
  do {
    pgVar2 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar64;
    local_1a8 = pgVar2->m[0].n;
    uStack_1a7 = pgVar2->m[1].n;
    uStack_1a6 = pgVar2->m[2].n;
    uStack_1a5 = pgVar2->m[3].n;
    uStack_1a4 = pgVar2->m[4].n;
    uStack_1a3 = pgVar2->m[5].n;
    uStack_1a2 = pgVar2->m[6].n;
    uStack_1a1 = pgVar2->m[7].n;
    uStack_1a0 = pgVar2->m[8].n;
    uStack_19f = pgVar2->m[9].n;
    uStack_19e = pgVar2->m[10].n;
    uStack_19d = pgVar2->m[0xb].n;
    uStack_19c = pgVar2->m[0xc].n;
    uStack_19b = pgVar2->m[0xd].n;
    uStack_19a = pgVar2->m[0xe].n;
    bStack_199 = pgVar2->m[0xf].n;
    auVar72[0] = -(local_1a8 == '\b');
    auVar72[1] = -(uStack_1a7 == '\b');
    auVar72[2] = -(uStack_1a6 == '\b');
    auVar72[3] = -(uStack_1a5 == '\b');
    auVar72[4] = -(uStack_1a4 == '\b');
    auVar72[5] = -(uStack_1a3 == '\b');
    auVar72[6] = -(uStack_1a2 == '\b');
    auVar72[7] = -(uStack_1a1 == '\b');
    auVar72[8] = -(uStack_1a0 == '\b');
    auVar72[9] = -(uStack_19f == '\b');
    auVar72[10] = -(uStack_19e == '\b');
    auVar72[0xb] = -(uStack_19d == '\b');
    auVar72[0xc] = -(uStack_19c == '\b');
    auVar72[0xd] = -(uStack_19b == '\b');
    auVar72[0xe] = -(uStack_19a == '\b');
    auVar72[0xf] = -(bStack_199 == 8);
    uVar14 = (ushort)(SUB161(auVar72 >> 7,0) & 1) | (ushort)(SUB161(auVar72 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar72 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar72 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar72 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar72 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar72 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar72 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar72 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar72 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar72 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar72 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar72 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar72 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar72 >> 0x77,0) & 1) << 0xe;
    if (uVar14 != 0) {
      uVar60 = (uint)uVar14;
      do {
        iVar53 = 0;
        if (uVar60 != 0) {
          for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
          }
        }
        if (*(int *)((long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 0) {
          lVar63 = (long)&ppVar7[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
          goto LAB_002d33f8;
        }
        uVar60 = uVar60 - 1 & uVar60;
      } while (uVar60 != 0);
    }
    if ((bStack_199 & 1) == 0) break;
    lVar63 = uVar64 + uVar54;
    uVar54 = uVar54 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar54 <= uVar59);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,(arrays_type *)this_00,0,0,&local_3d9,(SyntaxKind *)&local_3d8);
    psVar1 = &(this->knownTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0,&local_3d9,(SyntaxKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d33f8:
  *(Type **)(lVar63 + 8) = pTVar8;
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::parsing::TokenKind,_void>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
  ::rehash(local_3a8,0x13);
  sVar122 = parsing::LexerFacts::getTokenKindText(WireKeyword);
  pTVar8 = this->logicType;
  pNVar55 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar55,Wire,sVar122,pTVar8);
  local_3d8._M_len = CONCAT62(local_3d8._M_len._2_6_,0x14f);
  uVar54 = 0xa9849bd92785fb4 >>
           ((byte)(this->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar9 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.elements_;
  uVar59 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar62 = 0;
  uVar64 = uVar54;
  do {
    pgVar3 = (this->knownNetTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
             .arrays.groups_ + uVar64;
    local_1b8 = pgVar3->m[0].n;
    uStack_1b7 = pgVar3->m[1].n;
    uStack_1b6 = pgVar3->m[2].n;
    uStack_1b5 = pgVar3->m[3].n;
    uStack_1b4 = pgVar3->m[4].n;
    uStack_1b3 = pgVar3->m[5].n;
    uStack_1b2 = pgVar3->m[6].n;
    uStack_1b1 = pgVar3->m[7].n;
    uStack_1b0 = pgVar3->m[8].n;
    uStack_1af = pgVar3->m[9].n;
    uStack_1ae = pgVar3->m[10].n;
    uStack_1ad = pgVar3->m[0xb].n;
    uStack_1ac = pgVar3->m[0xc].n;
    uStack_1ab = pgVar3->m[0xd].n;
    uStack_1aa = pgVar3->m[0xe].n;
    bStack_1a9 = pgVar3->m[0xf].n;
    auVar73[0] = -(local_1b8 == 0xb4);
    auVar73[1] = -(uStack_1b7 == 0xb4);
    auVar73[2] = -(uStack_1b6 == 0xb4);
    auVar73[3] = -(uStack_1b5 == 0xb4);
    auVar73[4] = -(uStack_1b4 == 0xb4);
    auVar73[5] = -(uStack_1b3 == 0xb4);
    auVar73[6] = -(uStack_1b2 == 0xb4);
    auVar73[7] = -(uStack_1b1 == 0xb4);
    auVar73[8] = -(uStack_1b0 == 0xb4);
    auVar73[9] = -(uStack_1af == 0xb4);
    auVar73[10] = -(uStack_1ae == 0xb4);
    auVar73[0xb] = -(uStack_1ad == 0xb4);
    auVar73[0xc] = -(uStack_1ac == 0xb4);
    auVar73[0xd] = -(uStack_1ab == 0xb4);
    auVar73[0xe] = -(uStack_1aa == 0xb4);
    auVar73[0xf] = -(bStack_1a9 == 0xb4);
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar73 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar73 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar73 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar73 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar73 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar73 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar73 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar73 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar73 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar73 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar73 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar73 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar73 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar73 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar73 >> 0x77,0) & 1) << 0xe); uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      iVar53 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
        }
      }
      if (*(short *)((long)&ppVar9[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 0x14f) {
        lVar63 = (long)&ppVar9[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
        goto LAB_002d3556;
      }
    }
    if ((bStack_1a9 & 0x10) == 0) break;
    lVar63 = uVar64 + uVar62;
    uVar62 = uVar62 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar62 <= uVar59);
  if ((this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.size <
      (this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)local_3a8,&local_3a8->arrays,uVar54,0xa9849bd92785fb4,&local_3d9,
               (TokenKind *)&local_3d8);
    psVar1 = &(this->knownNetTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)local_3a8,0xa9849bd92785fb4,&local_3d9,(TokenKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d3556:
  pvVar10 = *(void **)(lVar63 + 8);
  *(NetType **)(lVar63 + 8) = pNVar55;
  if (pvVar10 != (void *)0x0) {
    operator_delete(pvVar10,0x98);
  }
  sVar122 = parsing::LexerFacts::getTokenKindText(WAndKeyword);
  pTVar8 = this->logicType;
  pNVar55 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar55,WAnd,sVar122,pTVar8);
  local_3d8._M_len = CONCAT62(local_3d8._M_len._2_6_,0x149);
  uVar54 = 0x554b6f6496b97636 >>
           ((byte)(this->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar9 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.elements_;
  uVar59 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar62 = 0;
  uVar64 = uVar54;
  do {
    pgVar3 = (this->knownNetTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
             .arrays.groups_ + uVar64;
    local_1c8 = pgVar3->m[0].n;
    uStack_1c7 = pgVar3->m[1].n;
    uStack_1c6 = pgVar3->m[2].n;
    uStack_1c5 = pgVar3->m[3].n;
    uStack_1c4 = pgVar3->m[4].n;
    uStack_1c3 = pgVar3->m[5].n;
    uStack_1c2 = pgVar3->m[6].n;
    uStack_1c1 = pgVar3->m[7].n;
    uStack_1c0 = pgVar3->m[8].n;
    uStack_1bf = pgVar3->m[9].n;
    uStack_1be = pgVar3->m[10].n;
    uStack_1bd = pgVar3->m[0xb].n;
    uStack_1bc = pgVar3->m[0xc].n;
    uStack_1bb = pgVar3->m[0xd].n;
    uStack_1ba = pgVar3->m[0xe].n;
    bStack_1b9 = pgVar3->m[0xf].n;
    auVar97[0] = -(local_1c8 == '6');
    auVar97[1] = -(uStack_1c7 == '6');
    auVar97[2] = -(uStack_1c6 == '6');
    auVar97[3] = -(uStack_1c5 == '6');
    auVar97[4] = -(uStack_1c4 == '6');
    auVar97[5] = -(uStack_1c3 == '6');
    auVar97[6] = -(uStack_1c2 == '6');
    auVar97[7] = -(uStack_1c1 == '6');
    auVar97[8] = -(uStack_1c0 == '6');
    auVar97[9] = -(uStack_1bf == '6');
    auVar97[10] = -(uStack_1be == '6');
    auVar97[0xb] = -(uStack_1bd == '6');
    auVar97[0xc] = -(uStack_1bc == '6');
    auVar97[0xd] = -(uStack_1bb == '6');
    auVar97[0xe] = -(uStack_1ba == '6');
    auVar97[0xf] = -(bStack_1b9 == 0x36);
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar97 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar97 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar97 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar97 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar97 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar97 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar97 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar97 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar97 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar97 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar97 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar97 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar97 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar97 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar97 >> 0x77,0) & 1) << 0xe); uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      iVar53 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
        }
      }
      if (*(short *)((long)&ppVar9[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 0x149) {
        lVar63 = (long)&ppVar9[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
        goto LAB_002d36ad;
      }
    }
    if ((bStack_1b9 & 0x40) == 0) break;
    lVar63 = uVar64 + uVar62;
    uVar62 = uVar62 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar62 <= uVar59);
  if ((this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.size <
      (this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)local_3a8,&local_3a8->arrays,uVar54,0x554b6f6496b97636,&local_3d9,
               (TokenKind *)&local_3d8);
    psVar1 = &(this->knownNetTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)local_3a8,0x554b6f6496b97636,&local_3d9,(TokenKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d36ad:
  pvVar10 = *(void **)(lVar63 + 8);
  *(NetType **)(lVar63 + 8) = pNVar55;
  if (pvVar10 != (void *)0x0) {
    operator_delete(pvVar10,0x98);
  }
  sVar122 = parsing::LexerFacts::getTokenKindText(WOrKeyword);
  pTVar8 = this->logicType;
  pNVar55 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar55,WOr,sVar122,pTVar8);
  local_3d8._M_len = CONCAT62(local_3d8._M_len._2_6_,0x152);
  uVar54 = 0xe53eb6ea1057d36a >>
           ((byte)(this->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar9 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.elements_;
  uVar59 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar62 = 0;
  uVar64 = uVar54;
  do {
    pgVar3 = (this->knownNetTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
             .arrays.groups_ + uVar64;
    local_1d8 = pgVar3->m[0].n;
    uStack_1d7 = pgVar3->m[1].n;
    uStack_1d6 = pgVar3->m[2].n;
    uStack_1d5 = pgVar3->m[3].n;
    uStack_1d4 = pgVar3->m[4].n;
    uStack_1d3 = pgVar3->m[5].n;
    uStack_1d2 = pgVar3->m[6].n;
    uStack_1d1 = pgVar3->m[7].n;
    uStack_1d0 = pgVar3->m[8].n;
    uStack_1cf = pgVar3->m[9].n;
    uStack_1ce = pgVar3->m[10].n;
    uStack_1cd = pgVar3->m[0xb].n;
    uStack_1cc = pgVar3->m[0xc].n;
    uStack_1cb = pgVar3->m[0xd].n;
    uStack_1ca = pgVar3->m[0xe].n;
    bStack_1c9 = pgVar3->m[0xf].n;
    auVar98[0] = -(local_1d8 == 'j');
    auVar98[1] = -(uStack_1d7 == 'j');
    auVar98[2] = -(uStack_1d6 == 'j');
    auVar98[3] = -(uStack_1d5 == 'j');
    auVar98[4] = -(uStack_1d4 == 'j');
    auVar98[5] = -(uStack_1d3 == 'j');
    auVar98[6] = -(uStack_1d2 == 'j');
    auVar98[7] = -(uStack_1d1 == 'j');
    auVar98[8] = -(uStack_1d0 == 'j');
    auVar98[9] = -(uStack_1cf == 'j');
    auVar98[10] = -(uStack_1ce == 'j');
    auVar98[0xb] = -(uStack_1cd == 'j');
    auVar98[0xc] = -(uStack_1cc == 'j');
    auVar98[0xd] = -(uStack_1cb == 'j');
    auVar98[0xe] = -(uStack_1ca == 'j');
    auVar98[0xf] = -(bStack_1c9 == 0x6a);
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar98 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar98 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar98 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar98 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar98 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar98 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar98 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar98 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar98 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar98 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar98 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar98 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar98 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar98 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar98 >> 0x77,0) & 1) << 0xe); uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      iVar53 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
        }
      }
      if (*(short *)((long)&ppVar9[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 0x152) {
        lVar63 = (long)&ppVar9[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
        goto LAB_002d3804;
      }
    }
    if ((bStack_1c9 & 4) == 0) break;
    lVar63 = uVar64 + uVar62;
    uVar62 = uVar62 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar62 <= uVar59);
  if ((this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.size <
      (this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)local_3a8,&local_3a8->arrays,uVar54,0xe53eb6ea1057d36a,&local_3d9,
               (TokenKind *)&local_3d8);
    psVar1 = &(this->knownNetTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)local_3a8,0xe53eb6ea1057d36a,&local_3d9,(TokenKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d3804:
  pvVar10 = *(void **)(lVar63 + 8);
  *(NetType **)(lVar63 + 8) = pNVar55;
  if (pvVar10 != (void *)0x0) {
    operator_delete(pvVar10,0x98);
  }
  sVar122 = parsing::LexerFacts::getTokenKindText(TriKeyword);
  pTVar8 = this->logicType;
  pNVar55 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar55,Tri,sVar122,pTVar8);
  local_3d8._M_len = CONCAT62(local_3d8._M_len._2_6_,0x132);
  uVar54 = 0x1e4f7fba270851a7 >>
           ((byte)(this->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar9 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.elements_;
  uVar59 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar62 = 0;
  uVar64 = uVar54;
  do {
    pgVar3 = (this->knownNetTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
             .arrays.groups_ + uVar64;
    local_1e8 = pgVar3->m[0].n;
    uStack_1e7 = pgVar3->m[1].n;
    uStack_1e6 = pgVar3->m[2].n;
    uStack_1e5 = pgVar3->m[3].n;
    uStack_1e4 = pgVar3->m[4].n;
    uStack_1e3 = pgVar3->m[5].n;
    uStack_1e2 = pgVar3->m[6].n;
    uStack_1e1 = pgVar3->m[7].n;
    uStack_1e0 = pgVar3->m[8].n;
    uStack_1df = pgVar3->m[9].n;
    uStack_1de = pgVar3->m[10].n;
    uStack_1dd = pgVar3->m[0xb].n;
    uStack_1dc = pgVar3->m[0xc].n;
    uStack_1db = pgVar3->m[0xd].n;
    uStack_1da = pgVar3->m[0xe].n;
    uStack_1d9 = pgVar3->m[0xf].n;
    auVar99[0] = -(local_1e8 == 0xa7);
    auVar99[1] = -(uStack_1e7 == 0xa7);
    auVar99[2] = -(uStack_1e6 == 0xa7);
    auVar99[3] = -(uStack_1e5 == 0xa7);
    auVar99[4] = -(uStack_1e4 == 0xa7);
    auVar99[5] = -(uStack_1e3 == 0xa7);
    auVar99[6] = -(uStack_1e2 == 0xa7);
    auVar99[7] = -(uStack_1e1 == 0xa7);
    auVar99[8] = -(uStack_1e0 == 0xa7);
    auVar99[9] = -(uStack_1df == 0xa7);
    auVar99[10] = -(uStack_1de == 0xa7);
    auVar99[0xb] = -(uStack_1dd == 0xa7);
    auVar99[0xc] = -(uStack_1dc == 0xa7);
    auVar99[0xd] = -(uStack_1db == 0xa7);
    auVar99[0xe] = -(uStack_1da == 0xa7);
    auVar99[0xf] = -(uStack_1d9 == 0xa7);
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar99 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar99 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar99 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar99 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar99 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar99 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar99 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar99 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar99 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar99 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar99 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar99 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar99 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar99 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar99 >> 0x77,0) & 1) << 0xe); uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      iVar53 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
        }
      }
      if (*(short *)((long)&ppVar9[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 0x132) {
        lVar63 = (long)&ppVar9[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
        goto LAB_002d395a;
      }
    }
    if (-1 < (char)uStack_1d9) break;
    lVar63 = uVar64 + uVar62;
    uVar62 = uVar62 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar62 <= uVar59);
  if ((this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.size <
      (this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)local_3a8,&local_3a8->arrays,uVar54,0x1e4f7fba270851a7,&local_3d9,
               (TokenKind *)&local_3d8);
    psVar1 = &(this->knownNetTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)local_3a8,0x1e4f7fba270851a7,&local_3d9,(TokenKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d395a:
  pvVar10 = *(void **)(lVar63 + 8);
  *(NetType **)(lVar63 + 8) = pNVar55;
  if (pvVar10 != (void *)0x0) {
    operator_delete(pvVar10,0x98);
  }
  sVar122 = parsing::LexerFacts::getTokenKindText(TriAndKeyword);
  pTVar8 = this->logicType;
  pNVar55 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar55,TriAnd,sVar122,pTVar8);
  local_3d8._M_len = CONCAT62(local_3d8._M_len._2_6_,0x135);
  uVar54 = 0xf8f5ece6a4e7c5e7 >>
           ((byte)(this->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar9 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.elements_;
  uVar59 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar62 = 0;
  uVar64 = uVar54;
  do {
    pgVar3 = (this->knownNetTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
             .arrays.groups_ + uVar64;
    local_1f8 = pgVar3->m[0].n;
    uStack_1f7 = pgVar3->m[1].n;
    uStack_1f6 = pgVar3->m[2].n;
    uStack_1f5 = pgVar3->m[3].n;
    uStack_1f4 = pgVar3->m[4].n;
    uStack_1f3 = pgVar3->m[5].n;
    uStack_1f2 = pgVar3->m[6].n;
    uStack_1f1 = pgVar3->m[7].n;
    uStack_1f0 = pgVar3->m[8].n;
    uStack_1ef = pgVar3->m[9].n;
    uStack_1ee = pgVar3->m[10].n;
    uStack_1ed = pgVar3->m[0xb].n;
    uStack_1ec = pgVar3->m[0xc].n;
    uStack_1eb = pgVar3->m[0xd].n;
    uStack_1ea = pgVar3->m[0xe].n;
    uStack_1e9 = pgVar3->m[0xf].n;
    auVar100[0] = -(local_1f8 == 0xe7);
    auVar100[1] = -(uStack_1f7 == 0xe7);
    auVar100[2] = -(uStack_1f6 == 0xe7);
    auVar100[3] = -(uStack_1f5 == 0xe7);
    auVar100[4] = -(uStack_1f4 == 0xe7);
    auVar100[5] = -(uStack_1f3 == 0xe7);
    auVar100[6] = -(uStack_1f2 == 0xe7);
    auVar100[7] = -(uStack_1f1 == 0xe7);
    auVar100[8] = -(uStack_1f0 == 0xe7);
    auVar100[9] = -(uStack_1ef == 0xe7);
    auVar100[10] = -(uStack_1ee == 0xe7);
    auVar100[0xb] = -(uStack_1ed == 0xe7);
    auVar100[0xc] = -(uStack_1ec == 0xe7);
    auVar100[0xd] = -(uStack_1eb == 0xe7);
    auVar100[0xe] = -(uStack_1ea == 0xe7);
    auVar100[0xf] = -(uStack_1e9 == 0xe7);
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar100 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar100 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar100 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar100 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar100 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar100 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar100 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar100 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar100 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar100 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar100 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar100 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar100 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar100 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar100 >> 0x77,0) & 1) << 0xe); uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      iVar53 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
        }
      }
      if (*(short *)((long)&ppVar9[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 0x135) {
        lVar63 = (long)&ppVar9[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
        goto LAB_002d3ab0;
      }
    }
    if (-1 < (char)uStack_1e9) break;
    lVar63 = uVar64 + uVar62;
    uVar62 = uVar62 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar62 <= uVar59);
  if ((this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.size <
      (this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)local_3a8,&local_3a8->arrays,uVar54,0xf8f5ece6a4e7c5e7,&local_3d9,
               (TokenKind *)&local_3d8);
    psVar1 = &(this->knownNetTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)local_3a8,0xf8f5ece6a4e7c5e7,&local_3d9,(TokenKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d3ab0:
  pvVar10 = *(void **)(lVar63 + 8);
  *(NetType **)(lVar63 + 8) = pNVar55;
  if (pvVar10 != (void *)0x0) {
    operator_delete(pvVar10,0x98);
  }
  sVar122 = parsing::LexerFacts::getTokenKindText(TriOrKeyword);
  pTVar8 = this->logicType;
  pNVar55 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar55,TriOr,sVar122,pTVar8);
  local_3d8._M_len = CONCAT62(local_3d8._M_len._2_6_,0x136);
  uVar54 = 0x972d66a0243241d1 >>
           ((byte)(this->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar9 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.elements_;
  uVar59 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar62 = 0;
  uVar64 = uVar54;
  do {
    pgVar3 = (this->knownNetTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
             .arrays.groups_ + uVar64;
    local_208 = pgVar3->m[0].n;
    uStack_207 = pgVar3->m[1].n;
    uStack_206 = pgVar3->m[2].n;
    uStack_205 = pgVar3->m[3].n;
    uStack_204 = pgVar3->m[4].n;
    uStack_203 = pgVar3->m[5].n;
    uStack_202 = pgVar3->m[6].n;
    uStack_201 = pgVar3->m[7].n;
    uStack_200 = pgVar3->m[8].n;
    uStack_1ff = pgVar3->m[9].n;
    uStack_1fe = pgVar3->m[10].n;
    uStack_1fd = pgVar3->m[0xb].n;
    uStack_1fc = pgVar3->m[0xc].n;
    uStack_1fb = pgVar3->m[0xd].n;
    uStack_1fa = pgVar3->m[0xe].n;
    bStack_1f9 = pgVar3->m[0xf].n;
    auVar74[0] = -(local_208 == 0xd1);
    auVar74[1] = -(uStack_207 == 0xd1);
    auVar74[2] = -(uStack_206 == 0xd1);
    auVar74[3] = -(uStack_205 == 0xd1);
    auVar74[4] = -(uStack_204 == 0xd1);
    auVar74[5] = -(uStack_203 == 0xd1);
    auVar74[6] = -(uStack_202 == 0xd1);
    auVar74[7] = -(uStack_201 == 0xd1);
    auVar74[8] = -(uStack_200 == 0xd1);
    auVar74[9] = -(uStack_1ff == 0xd1);
    auVar74[10] = -(uStack_1fe == 0xd1);
    auVar74[0xb] = -(uStack_1fd == 0xd1);
    auVar74[0xc] = -(uStack_1fc == 0xd1);
    auVar74[0xd] = -(uStack_1fb == 0xd1);
    auVar74[0xe] = -(uStack_1fa == 0xd1);
    auVar74[0xf] = -(bStack_1f9 == 0xd1);
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar74 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar74 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar74 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar74 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar74 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar74 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar74 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar74 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar74 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar74 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar74 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar74 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar74 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar74 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar74 >> 0x77,0) & 1) << 0xe); uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      iVar53 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
        }
      }
      if (*(short *)((long)&ppVar9[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 0x136) {
        lVar63 = (long)&ppVar9[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
        goto LAB_002d3c03;
      }
    }
    if ((bStack_1f9 & 2) == 0) break;
    lVar63 = uVar64 + uVar62;
    uVar62 = uVar62 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar62 <= uVar59);
  if ((this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.size <
      (this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)local_3a8,&local_3a8->arrays,uVar54,0x972d66a0243241d1,&local_3d9,
               (TokenKind *)&local_3d8);
    psVar1 = &(this->knownNetTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)local_3a8,0x972d66a0243241d1,&local_3d9,(TokenKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d3c03:
  pvVar10 = *(void **)(lVar63 + 8);
  *(NetType **)(lVar63 + 8) = pNVar55;
  if (pvVar10 != (void *)0x0) {
    operator_delete(pvVar10,0x98);
  }
  sVar122 = parsing::LexerFacts::getTokenKindText(Tri0Keyword);
  pTVar8 = this->logicType;
  pNVar55 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar55,Tri0,sVar122,pTVar8);
  local_3d8._M_len = CONCAT62(local_3d8._M_len._2_6_,0x133);
  uVar54 = 0xbc86f973a652cd92 >>
           ((byte)(this->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar9 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.elements_;
  uVar59 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar62 = 0;
  uVar64 = uVar54;
  do {
    pgVar3 = (this->knownNetTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
             .arrays.groups_ + uVar64;
    local_218 = pgVar3->m[0].n;
    uStack_217 = pgVar3->m[1].n;
    uStack_216 = pgVar3->m[2].n;
    uStack_215 = pgVar3->m[3].n;
    uStack_214 = pgVar3->m[4].n;
    uStack_213 = pgVar3->m[5].n;
    uStack_212 = pgVar3->m[6].n;
    uStack_211 = pgVar3->m[7].n;
    uStack_210 = pgVar3->m[8].n;
    uStack_20f = pgVar3->m[9].n;
    uStack_20e = pgVar3->m[10].n;
    uStack_20d = pgVar3->m[0xb].n;
    uStack_20c = pgVar3->m[0xc].n;
    uStack_20b = pgVar3->m[0xd].n;
    uStack_20a = pgVar3->m[0xe].n;
    bStack_209 = pgVar3->m[0xf].n;
    auVar75[0] = -(local_218 == 0x92);
    auVar75[1] = -(uStack_217 == 0x92);
    auVar75[2] = -(uStack_216 == 0x92);
    auVar75[3] = -(uStack_215 == 0x92);
    auVar75[4] = -(uStack_214 == 0x92);
    auVar75[5] = -(uStack_213 == 0x92);
    auVar75[6] = -(uStack_212 == 0x92);
    auVar75[7] = -(uStack_211 == 0x92);
    auVar75[8] = -(uStack_210 == 0x92);
    auVar75[9] = -(uStack_20f == 0x92);
    auVar75[10] = -(uStack_20e == 0x92);
    auVar75[0xb] = -(uStack_20d == 0x92);
    auVar75[0xc] = -(uStack_20c == 0x92);
    auVar75[0xd] = -(uStack_20b == 0x92);
    auVar75[0xe] = -(uStack_20a == 0x92);
    auVar75[0xf] = -(bStack_209 == 0x92);
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar75 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar75 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar75 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar75 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar75 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar75 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar75 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar75 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar75 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar75 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar75 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar75 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar75 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar75 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar75 >> 0x77,0) & 1) << 0xe); uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      iVar53 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
        }
      }
      if (*(short *)((long)&ppVar9[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 0x133) {
        lVar63 = (long)&ppVar9[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
        goto LAB_002d3d56;
      }
    }
    if ((bStack_209 & 4) == 0) break;
    lVar63 = uVar64 + uVar62;
    uVar62 = uVar62 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar62 <= uVar59);
  if ((this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.size <
      (this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)local_3a8,&local_3a8->arrays,uVar54,0xbc86f973a652cd92,&local_3d9,
               (TokenKind *)&local_3d8);
    psVar1 = &(this->knownNetTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)local_3a8,0xbc86f973a652cd92,&local_3d9,(TokenKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d3d56:
  pvVar10 = *(void **)(lVar63 + 8);
  *(NetType **)(lVar63 + 8) = pNVar55;
  if (pvVar10 != (void *)0x0) {
    operator_delete(pvVar10,0x98);
  }
  sVar122 = parsing::LexerFacts::getTokenKindText(Tri1Keyword);
  pTVar8 = this->logicType;
  pNVar55 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar55,Tri1,sVar122,pTVar8);
  local_3d8._M_len = CONCAT62(local_3d8._M_len._2_6_,0x134);
  uVar54 = 0x5abe732d259d49fa >>
           ((byte)(this->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar9 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.elements_;
  uVar59 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar62 = 0;
  uVar64 = uVar54;
  do {
    pgVar3 = (this->knownNetTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
             .arrays.groups_ + uVar64;
    local_228 = pgVar3->m[0].n;
    uStack_227 = pgVar3->m[1].n;
    uStack_226 = pgVar3->m[2].n;
    uStack_225 = pgVar3->m[3].n;
    uStack_224 = pgVar3->m[4].n;
    uStack_223 = pgVar3->m[5].n;
    uStack_222 = pgVar3->m[6].n;
    uStack_221 = pgVar3->m[7].n;
    uStack_220 = pgVar3->m[8].n;
    uStack_21f = pgVar3->m[9].n;
    uStack_21e = pgVar3->m[10].n;
    uStack_21d = pgVar3->m[0xb].n;
    uStack_21c = pgVar3->m[0xc].n;
    uStack_21b = pgVar3->m[0xd].n;
    uStack_21a = pgVar3->m[0xe].n;
    bStack_219 = pgVar3->m[0xf].n;
    auVar101[0] = -(local_228 == 0xfa);
    auVar101[1] = -(uStack_227 == 0xfa);
    auVar101[2] = -(uStack_226 == 0xfa);
    auVar101[3] = -(uStack_225 == 0xfa);
    auVar101[4] = -(uStack_224 == 0xfa);
    auVar101[5] = -(uStack_223 == 0xfa);
    auVar101[6] = -(uStack_222 == 0xfa);
    auVar101[7] = -(uStack_221 == 0xfa);
    auVar101[8] = -(uStack_220 == 0xfa);
    auVar101[9] = -(uStack_21f == 0xfa);
    auVar101[10] = -(uStack_21e == 0xfa);
    auVar101[0xb] = -(uStack_21d == 0xfa);
    auVar101[0xc] = -(uStack_21c == 0xfa);
    auVar101[0xd] = -(uStack_21b == 0xfa);
    auVar101[0xe] = -(uStack_21a == 0xfa);
    auVar101[0xf] = -(bStack_219 == 0xfa);
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar101 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar101 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar101 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar101 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar101 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar101 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar101 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar101 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar101 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar101 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar101 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar101 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar101 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar101 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar101 >> 0x77,0) & 1) << 0xe); uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      iVar53 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
        }
      }
      if (*(short *)((long)&ppVar9[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 0x134) {
        lVar63 = (long)&ppVar9[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
        goto LAB_002d3ead;
      }
    }
    if ((bStack_219 & 4) == 0) break;
    lVar63 = uVar64 + uVar62;
    uVar62 = uVar62 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar62 <= uVar59);
  if ((this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.size <
      (this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)local_3a8,&local_3a8->arrays,uVar54,0x5abe732d259d49fa,&local_3d9,
               (TokenKind *)&local_3d8);
    psVar1 = &(this->knownNetTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)local_3a8,0x5abe732d259d49fa,&local_3d9,(TokenKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d3ead:
  pvVar10 = *(void **)(lVar63 + 8);
  *(NetType **)(lVar63 + 8) = pNVar55;
  if (pvVar10 != (void *)0x0) {
    operator_delete(pvVar10,0x98);
  }
  sVar122 = parsing::LexerFacts::getTokenKindText(TriRegKeyword);
  pTVar8 = this->logicType;
  pNVar55 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar55,TriReg,sVar122,pTVar8);
  local_3d8._M_len = CONCAT62(local_3d8._M_len._2_6_,0x137);
  uVar54 = 0x3564e059a37cbd43 >>
           ((byte)(this->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar9 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.elements_;
  uVar59 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar62 = 0;
  uVar64 = uVar54;
  do {
    pgVar3 = (this->knownNetTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
             .arrays.groups_ + uVar64;
    local_238 = pgVar3->m[0].n;
    uStack_237 = pgVar3->m[1].n;
    uStack_236 = pgVar3->m[2].n;
    uStack_235 = pgVar3->m[3].n;
    uStack_234 = pgVar3->m[4].n;
    uStack_233 = pgVar3->m[5].n;
    uStack_232 = pgVar3->m[6].n;
    uStack_231 = pgVar3->m[7].n;
    uStack_230 = pgVar3->m[8].n;
    uStack_22f = pgVar3->m[9].n;
    uStack_22e = pgVar3->m[10].n;
    uStack_22d = pgVar3->m[0xb].n;
    uStack_22c = pgVar3->m[0xc].n;
    uStack_22b = pgVar3->m[0xd].n;
    uStack_22a = pgVar3->m[0xe].n;
    bStack_229 = pgVar3->m[0xf].n;
    auVar102[0] = -(local_238 == 'C');
    auVar102[1] = -(uStack_237 == 'C');
    auVar102[2] = -(uStack_236 == 'C');
    auVar102[3] = -(uStack_235 == 'C');
    auVar102[4] = -(uStack_234 == 'C');
    auVar102[5] = -(uStack_233 == 'C');
    auVar102[6] = -(uStack_232 == 'C');
    auVar102[7] = -(uStack_231 == 'C');
    auVar102[8] = -(uStack_230 == 'C');
    auVar102[9] = -(uStack_22f == 'C');
    auVar102[10] = -(uStack_22e == 'C');
    auVar102[0xb] = -(uStack_22d == 'C');
    auVar102[0xc] = -(uStack_22c == 'C');
    auVar102[0xd] = -(uStack_22b == 'C');
    auVar102[0xe] = -(uStack_22a == 'C');
    auVar102[0xf] = -(bStack_229 == 0x43);
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar102 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar102 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar102 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar102 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar102 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar102 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar102 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar102 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar102 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar102 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar102 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar102 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar102 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar102 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar102 >> 0x77,0) & 1) << 0xe); uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      iVar53 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
        }
      }
      if (*(short *)((long)&ppVar9[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 0x137) {
        lVar63 = (long)&ppVar9[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
        goto LAB_002d4004;
      }
    }
    if ((bStack_229 & 8) == 0) break;
    lVar63 = uVar64 + uVar62;
    uVar62 = uVar62 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar62 <= uVar59);
  if ((this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.size <
      (this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)local_3a8,&local_3a8->arrays,uVar54,0x3564e059a37cbd43,&local_3d9,
               (TokenKind *)&local_3d8);
    psVar1 = &(this->knownNetTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)local_3a8,0x3564e059a37cbd43,&local_3d9,(TokenKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d4004:
  pvVar10 = *(void **)(lVar63 + 8);
  *(NetType **)(lVar63 + 8) = pNVar55;
  if (pvVar10 != (void *)0x0) {
    operator_delete(pvVar10,0x98);
  }
  sVar122 = parsing::LexerFacts::getTokenKindText(Supply0Keyword);
  pTVar8 = this->logicType;
  pNVar55 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar55,Supply0,sVar122,pTVar8);
  local_3d8._M_len = CONCAT62(local_3d8._M_len._2_6_,0x123);
  uVar54 = 0xd90f5ddbb1ab0b6c >>
           ((byte)(this->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar9 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.elements_;
  uVar59 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar62 = 0;
  uVar64 = uVar54;
  do {
    pgVar3 = (this->knownNetTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
             .arrays.groups_ + uVar64;
    local_248 = pgVar3->m[0].n;
    uStack_247 = pgVar3->m[1].n;
    uStack_246 = pgVar3->m[2].n;
    uStack_245 = pgVar3->m[3].n;
    uStack_244 = pgVar3->m[4].n;
    uStack_243 = pgVar3->m[5].n;
    uStack_242 = pgVar3->m[6].n;
    uStack_241 = pgVar3->m[7].n;
    uStack_240 = pgVar3->m[8].n;
    uStack_23f = pgVar3->m[9].n;
    uStack_23e = pgVar3->m[10].n;
    uStack_23d = pgVar3->m[0xb].n;
    uStack_23c = pgVar3->m[0xc].n;
    uStack_23b = pgVar3->m[0xd].n;
    uStack_23a = pgVar3->m[0xe].n;
    bStack_239 = pgVar3->m[0xf].n;
    auVar103[0] = -(local_248 == 'l');
    auVar103[1] = -(uStack_247 == 'l');
    auVar103[2] = -(uStack_246 == 'l');
    auVar103[3] = -(uStack_245 == 'l');
    auVar103[4] = -(uStack_244 == 'l');
    auVar103[5] = -(uStack_243 == 'l');
    auVar103[6] = -(uStack_242 == 'l');
    auVar103[7] = -(uStack_241 == 'l');
    auVar103[8] = -(uStack_240 == 'l');
    auVar103[9] = -(uStack_23f == 'l');
    auVar103[10] = -(uStack_23e == 'l');
    auVar103[0xb] = -(uStack_23d == 'l');
    auVar103[0xc] = -(uStack_23c == 'l');
    auVar103[0xd] = -(uStack_23b == 'l');
    auVar103[0xe] = -(uStack_23a == 'l');
    auVar103[0xf] = -(bStack_239 == 0x6c);
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar103 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar103 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar103 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar103 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar103 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar103 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar103 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar103 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar103 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar103 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar103 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar103 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar103 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar103 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar103 >> 0x77,0) & 1) << 0xe); uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      iVar53 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
        }
      }
      if (*(short *)((long)&ppVar9[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 0x123) {
        lVar63 = (long)&ppVar9[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
        goto LAB_002d415b;
      }
    }
    if ((bStack_239 & 0x10) == 0) break;
    lVar63 = uVar64 + uVar62;
    uVar62 = uVar62 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar62 <= uVar59);
  if ((this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.size <
      (this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)local_3a8,&local_3a8->arrays,uVar54,0xd90f5ddbb1ab0b6c,&local_3d9,
               (TokenKind *)&local_3d8);
    psVar1 = &(this->knownNetTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)local_3a8,0xd90f5ddbb1ab0b6c,&local_3d9,(TokenKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d415b:
  pvVar10 = *(void **)(lVar63 + 8);
  *(NetType **)(lVar63 + 8) = pNVar55;
  if (pvVar10 != (void *)0x0) {
    operator_delete(pvVar10,0x98);
  }
  sVar122 = parsing::LexerFacts::getTokenKindText(Supply1Keyword);
  pTVar8 = this->logicType;
  pNVar55 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar55,Supply1,sVar122,pTVar8);
  local_3d8._M_len = CONCAT62(local_3d8._M_len._2_6_,0x124);
  uVar54 = 0x7746d79530f58740 >>
           ((byte)(this->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar9 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.elements_;
  uVar59 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar62 = 0;
  uVar64 = uVar54;
  do {
    pgVar3 = (this->knownNetTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
             .arrays.groups_ + uVar64;
    local_258 = pgVar3->m[0].n;
    uStack_257 = pgVar3->m[1].n;
    uStack_256 = pgVar3->m[2].n;
    uStack_255 = pgVar3->m[3].n;
    uStack_254 = pgVar3->m[4].n;
    uStack_253 = pgVar3->m[5].n;
    uStack_252 = pgVar3->m[6].n;
    uStack_251 = pgVar3->m[7].n;
    uStack_250 = pgVar3->m[8].n;
    uStack_24f = pgVar3->m[9].n;
    uStack_24e = pgVar3->m[10].n;
    uStack_24d = pgVar3->m[0xb].n;
    uStack_24c = pgVar3->m[0xc].n;
    uStack_24b = pgVar3->m[0xd].n;
    uStack_24a = pgVar3->m[0xe].n;
    bStack_249 = pgVar3->m[0xf].n;
    auVar104[0] = -(local_258 == '@');
    auVar104[1] = -(uStack_257 == '@');
    auVar104[2] = -(uStack_256 == '@');
    auVar104[3] = -(uStack_255 == '@');
    auVar104[4] = -(uStack_254 == '@');
    auVar104[5] = -(uStack_253 == '@');
    auVar104[6] = -(uStack_252 == '@');
    auVar104[7] = -(uStack_251 == '@');
    auVar104[8] = -(uStack_250 == '@');
    auVar104[9] = -(uStack_24f == '@');
    auVar104[10] = -(uStack_24e == '@');
    auVar104[0xb] = -(uStack_24d == '@');
    auVar104[0xc] = -(uStack_24c == '@');
    auVar104[0xd] = -(uStack_24b == '@');
    auVar104[0xe] = -(uStack_24a == '@');
    auVar104[0xf] = -(bStack_249 == 0x40);
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar104 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar104 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar104 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar104 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar104 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar104 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar104 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar104 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar104 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar104 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar104 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar104 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar104 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar104 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar104 >> 0x77,0) & 1) << 0xe); uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      iVar53 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
        }
      }
      if (*(short *)((long)&ppVar9[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 0x124) {
        lVar63 = (long)&ppVar9[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
        goto LAB_002d42b2;
      }
    }
    if ((bStack_249 & 1) == 0) break;
    lVar63 = uVar64 + uVar62;
    uVar62 = uVar62 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar62 <= uVar59);
  if ((this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.size <
      (this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)local_3a8,&local_3a8->arrays,uVar54,0x7746d79530f58740,&local_3d9,
               (TokenKind *)&local_3d8);
    psVar1 = &(this->knownNetTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)local_3a8,0x7746d79530f58740,&local_3d9,(TokenKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d42b2:
  pvVar10 = *(void **)(lVar63 + 8);
  *(NetType **)(lVar63 + 8) = pNVar55;
  if (pvVar10 != (void *)0x0) {
    operator_delete(pvVar10,0x98);
  }
  sVar122 = parsing::LexerFacts::getTokenKindText(UWireKeyword);
  pTVar8 = this->logicType;
  pNVar55 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar55,UWire,sVar122,pTVar8);
  local_3d8._M_len = CONCAT62(local_3d8._M_len._2_6_,0x142);
  uVar54 = 0x1c71b521bb012ad >>
           ((byte)(this->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar9 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.elements_;
  uVar59 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar62 = 0;
  uVar64 = uVar54;
  do {
    pgVar3 = (this->knownNetTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
             .arrays.groups_ + uVar64;
    local_268 = pgVar3->m[0].n;
    uStack_267 = pgVar3->m[1].n;
    uStack_266 = pgVar3->m[2].n;
    uStack_265 = pgVar3->m[3].n;
    uStack_264 = pgVar3->m[4].n;
    uStack_263 = pgVar3->m[5].n;
    uStack_262 = pgVar3->m[6].n;
    uStack_261 = pgVar3->m[7].n;
    uStack_260 = pgVar3->m[8].n;
    uStack_25f = pgVar3->m[9].n;
    uStack_25e = pgVar3->m[10].n;
    uStack_25d = pgVar3->m[0xb].n;
    uStack_25c = pgVar3->m[0xc].n;
    uStack_25b = pgVar3->m[0xd].n;
    uStack_25a = pgVar3->m[0xe].n;
    bStack_259 = pgVar3->m[0xf].n;
    auVar105[0] = -(local_268 == 0xad);
    auVar105[1] = -(uStack_267 == 0xad);
    auVar105[2] = -(uStack_266 == 0xad);
    auVar105[3] = -(uStack_265 == 0xad);
    auVar105[4] = -(uStack_264 == 0xad);
    auVar105[5] = -(uStack_263 == 0xad);
    auVar105[6] = -(uStack_262 == 0xad);
    auVar105[7] = -(uStack_261 == 0xad);
    auVar105[8] = -(uStack_260 == 0xad);
    auVar105[9] = -(uStack_25f == 0xad);
    auVar105[10] = -(uStack_25e == 0xad);
    auVar105[0xb] = -(uStack_25d == 0xad);
    auVar105[0xc] = -(uStack_25c == 0xad);
    auVar105[0xd] = -(uStack_25b == 0xad);
    auVar105[0xe] = -(uStack_25a == 0xad);
    auVar105[0xf] = -(bStack_259 == 0xad);
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar105 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar105 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar105 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar105 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar105 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar105 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar105 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar105 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar105 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar105 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar105 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar105 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar105 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar105 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar105 >> 0x77,0) & 1) << 0xe); uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      iVar53 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
        }
      }
      if (*(short *)((long)&ppVar9[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 0x142) {
        lVar63 = (long)&ppVar9[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
        goto LAB_002d4409;
      }
    }
    if ((bStack_259 & 0x20) == 0) break;
    lVar63 = uVar64 + uVar62;
    uVar62 = uVar62 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar62 <= uVar59);
  if ((this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.size <
      (this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)local_3a8,&local_3a8->arrays,uVar54,0x1c71b521bb012ad,&local_3d9,
               (TokenKind *)&local_3d8);
    psVar1 = &(this->knownNetTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)local_3a8,0x1c71b521bb012ad,&local_3d9,(TokenKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d4409:
  pvVar10 = *(void **)(lVar63 + 8);
  *(NetType **)(lVar63 + 8) = pNVar55;
  if (pvVar10 != (void *)0x0) {
    operator_delete(pvVar10,0x98);
  }
  sVar122 = parsing::LexerFacts::getTokenKindText(InterconnectKeyword);
  pTVar8 = this->logicType;
  pNVar55 = (NetType *)operator_new(0x98);
  NetType::NetType(pNVar55,Interconnect,sVar122,pTVar8);
  local_3d8._M_len = CONCAT62(local_3d8._M_len._2_6_,199);
  uVar54 = 0xfd1f9f31f2e67429 >>
           ((byte)(this->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar9 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.elements_;
  uVar59 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar62 = 0;
  uVar64 = uVar54;
  do {
    pgVar3 = (this->knownNetTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
             .arrays.groups_ + uVar64;
    local_278 = pgVar3->m[0].n;
    uStack_277 = pgVar3->m[1].n;
    uStack_276 = pgVar3->m[2].n;
    uStack_275 = pgVar3->m[3].n;
    uStack_274 = pgVar3->m[4].n;
    uStack_273 = pgVar3->m[5].n;
    uStack_272 = pgVar3->m[6].n;
    uStack_271 = pgVar3->m[7].n;
    uStack_270 = pgVar3->m[8].n;
    uStack_26f = pgVar3->m[9].n;
    uStack_26e = pgVar3->m[10].n;
    uStack_26d = pgVar3->m[0xb].n;
    uStack_26c = pgVar3->m[0xc].n;
    uStack_26b = pgVar3->m[0xd].n;
    uStack_26a = pgVar3->m[0xe].n;
    bStack_269 = pgVar3->m[0xf].n;
    auVar106[0] = -(local_278 == ')');
    auVar106[1] = -(uStack_277 == ')');
    auVar106[2] = -(uStack_276 == ')');
    auVar106[3] = -(uStack_275 == ')');
    auVar106[4] = -(uStack_274 == ')');
    auVar106[5] = -(uStack_273 == ')');
    auVar106[6] = -(uStack_272 == ')');
    auVar106[7] = -(uStack_271 == ')');
    auVar106[8] = -(uStack_270 == ')');
    auVar106[9] = -(uStack_26f == ')');
    auVar106[10] = -(uStack_26e == ')');
    auVar106[0xb] = -(uStack_26d == ')');
    auVar106[0xc] = -(uStack_26c == ')');
    auVar106[0xd] = -(uStack_26b == ')');
    auVar106[0xe] = -(uStack_26a == ')');
    auVar106[0xf] = -(bStack_269 == 0x29);
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar106 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar106 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar106 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar106 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar106 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar106 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar106 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar106 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar106 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar106 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar106 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar106 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar106 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar106 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar106 >> 0x77,0) & 1) << 0xe); uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      iVar53 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
        }
      }
      if (*(short *)((long)&ppVar9[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 199) {
        lVar63 = (long)&ppVar9[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
        goto LAB_002d4560;
      }
    }
    if ((bStack_269 & 2) == 0) break;
    lVar63 = uVar64 + uVar62;
    uVar62 = uVar62 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar62 <= uVar59);
  if ((this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.size <
      (this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)local_3a8,&local_3a8->arrays,uVar54,0xfd1f9f31f2e67429,&local_3d9,
               (TokenKind *)&local_3d8);
    psVar1 = &(this->knownNetTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)local_3a8,0xfd1f9f31f2e67429,&local_3d9,(TokenKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d4560:
  pvVar10 = *(void **)(lVar63 + 8);
  *(NetType **)(lVar63 + 8) = pNVar55;
  if (pvVar10 != (void *)0x0) {
    operator_delete(pvVar10,0x98);
  }
  pTVar8 = this->logicType;
  pNVar55 = (NetType *)operator_new(0x98);
  sVar122._M_str = "<error>";
  sVar122._M_len = 7;
  NetType::NetType(pNVar55,Unknown,sVar122,pTVar8);
  local_3d8._M_len = local_3d8._M_len & 0xffffffffffff0000;
  uVar59 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  ppVar9 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.elements_;
  uVar64 = 0;
  uVar54 = 0;
  do {
    pgVar3 = (this->knownNetTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
             .arrays.groups_ + uVar64;
    local_288 = pgVar3->m[0].n;
    uStack_287 = pgVar3->m[1].n;
    uStack_286 = pgVar3->m[2].n;
    uStack_285 = pgVar3->m[3].n;
    uStack_284 = pgVar3->m[4].n;
    uStack_283 = pgVar3->m[5].n;
    uStack_282 = pgVar3->m[6].n;
    uStack_281 = pgVar3->m[7].n;
    uStack_280 = pgVar3->m[8].n;
    uStack_27f = pgVar3->m[9].n;
    uStack_27e = pgVar3->m[10].n;
    uStack_27d = pgVar3->m[0xb].n;
    uStack_27c = pgVar3->m[0xc].n;
    uStack_27b = pgVar3->m[0xd].n;
    uStack_27a = pgVar3->m[0xe].n;
    bStack_279 = pgVar3->m[0xf].n;
    auVar76[0] = -(local_288 == '\b');
    auVar76[1] = -(uStack_287 == '\b');
    auVar76[2] = -(uStack_286 == '\b');
    auVar76[3] = -(uStack_285 == '\b');
    auVar76[4] = -(uStack_284 == '\b');
    auVar76[5] = -(uStack_283 == '\b');
    auVar76[6] = -(uStack_282 == '\b');
    auVar76[7] = -(uStack_281 == '\b');
    auVar76[8] = -(uStack_280 == '\b');
    auVar76[9] = -(uStack_27f == '\b');
    auVar76[10] = -(uStack_27e == '\b');
    auVar76[0xb] = -(uStack_27d == '\b');
    auVar76[0xc] = -(uStack_27c == '\b');
    auVar76[0xd] = -(uStack_27b == '\b');
    auVar76[0xe] = -(uStack_27a == '\b');
    auVar76[0xf] = -(bStack_279 == 8);
    uVar14 = (ushort)(SUB161(auVar76 >> 7,0) & 1) | (ushort)(SUB161(auVar76 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar76 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar76 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar76 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar76 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar76 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar76 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar76 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar76 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar76 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar76 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar76 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar76 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar76 >> 0x77,0) & 1) << 0xe;
    if (uVar14 != 0) {
      uVar60 = (uint)uVar14;
      do {
        iVar53 = 0;
        if (uVar60 != 0) {
          for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
          }
        }
        if (*(short *)((long)&ppVar9[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 0) {
          lVar63 = (long)&ppVar9[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
          goto LAB_002d4689;
        }
        uVar60 = uVar60 - 1 & uVar60;
      } while (uVar60 != 0);
    }
    if ((bStack_279 & 1) == 0) break;
    lVar63 = uVar64 + uVar54;
    uVar54 = uVar54 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar54 <= uVar59);
  if ((this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.size <
      (this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)local_3a8,&local_3a8->arrays,0,0,&local_3d9,(TokenKind *)&local_3d8);
    psVar1 = &(this->knownNetTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)local_3a8,0,&local_3d9,(TokenKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d4689:
  pvVar10 = *(void **)(lVar63 + 8);
  *(NetType **)(lVar63 + 8) = pNVar55;
  if (pvVar10 != (void *)0x0) {
    operator_delete(pvVar10,0x98);
  }
  local_3d8._M_len = CONCAT62(local_3d8._M_len._2_6_,0x14f);
  uVar62 = 0xa9849bd92785fb4 >>
           ((byte)(this->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar9 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.elements_;
  uVar59 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar54 = 0;
  uVar64 = uVar62;
  do {
    pgVar3 = (this->knownNetTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
             .arrays.groups_ + uVar64;
    local_298 = pgVar3->m[0].n;
    uStack_297 = pgVar3->m[1].n;
    uStack_296 = pgVar3->m[2].n;
    uStack_295 = pgVar3->m[3].n;
    uStack_294 = pgVar3->m[4].n;
    uStack_293 = pgVar3->m[5].n;
    uStack_292 = pgVar3->m[6].n;
    uStack_291 = pgVar3->m[7].n;
    uStack_290 = pgVar3->m[8].n;
    uStack_28f = pgVar3->m[9].n;
    uStack_28e = pgVar3->m[10].n;
    uStack_28d = pgVar3->m[0xb].n;
    uStack_28c = pgVar3->m[0xc].n;
    uStack_28b = pgVar3->m[0xd].n;
    uStack_28a = pgVar3->m[0xe].n;
    bStack_289 = pgVar3->m[0xf].n;
    auVar77[0] = -(local_298 == 0xb4);
    auVar77[1] = -(uStack_297 == 0xb4);
    auVar77[2] = -(uStack_296 == 0xb4);
    auVar77[3] = -(uStack_295 == 0xb4);
    auVar77[4] = -(uStack_294 == 0xb4);
    auVar77[5] = -(uStack_293 == 0xb4);
    auVar77[6] = -(uStack_292 == 0xb4);
    auVar77[7] = -(uStack_291 == 0xb4);
    auVar77[8] = -(uStack_290 == 0xb4);
    auVar77[9] = -(uStack_28f == 0xb4);
    auVar77[10] = -(uStack_28e == 0xb4);
    auVar77[0xb] = -(uStack_28d == 0xb4);
    auVar77[0xc] = -(uStack_28c == 0xb4);
    auVar77[0xd] = -(uStack_28b == 0xb4);
    auVar77[0xe] = -(uStack_28a == 0xb4);
    auVar77[0xf] = -(bStack_289 == 0xb4);
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar77 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar77 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar77 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar77 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar77 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar77 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar77 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar77 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar77 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar77 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar77 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar77 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar77 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar77 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar77 >> 0x77,0) & 1) << 0xe); uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      iVar53 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> iVar53 & 1) == 0; iVar53 = iVar53 + 1) {
        }
      }
      if (*(short *)((long)&ppVar9[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4)) == 0x14f) {
        lVar63 = (long)&ppVar9[uVar64 * 0xf].first + (ulong)(uint)(iVar53 << 4);
        goto LAB_002d4798;
      }
    }
    if ((bStack_289 & 0x10) == 0) break;
    lVar63 = uVar64 + uVar54;
    uVar54 = uVar54 + 1;
    uVar64 = lVar63 + 1U & uVar59;
  } while (uVar54 <= uVar59);
  if ((this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.size <
      (this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)local_3a8,&local_3a8->arrays,uVar62,0xa9849bd92785fb4,&local_3d9,
               (TokenKind *)&local_3d8);
    psVar1 = &(this->knownNetTypes).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)local_3a8,0xa9849bd92785fb4,&local_3d9,(TokenKind *)&local_3d8);
  }
  lVar63 = CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d4798:
  this->wireNetType = *(NetType **)(lVar63 + 8);
  pTVar8 = this->bitType;
  bVar50 = Type::getIntegralFlags(pTVar8);
  this->scalarTypeTable[bVar50.m_bits & 7] = pTVar8;
  pTVar8 = this->logicType;
  bVar50 = Type::getIntegralFlags(pTVar8);
  this->scalarTypeTable[bVar50.m_bits & 7] = pTVar8;
  bVar50 = Type::getIntegralFlags((Type *)(ast::builtins::Builtins::Instance + 0xb0));
  this->scalarTypeTable[bVar50.m_bits & 7] = (Type *)(ast::builtins::Builtins::Instance + 0xb0);
  bVar50 = Type::getIntegralFlags((Type *)(ast::builtins::Builtins::Instance + 0x108));
  this->scalarTypeTable[bVar50.m_bits & 7] = (Type *)(ast::builtins::Builtins::Instance + 0x108);
  bVar50 = Type::getIntegralFlags((Type *)(ast::builtins::Builtins::Instance + 0x160));
  this->scalarTypeTable[bVar50.m_bits & 7] = (Type *)(ast::builtins::Builtins::Instance + 0x160);
  bVar50 = Type::getIntegralFlags((Type *)(ast::builtins::Builtins::Instance + 0x1b8));
  this->scalarTypeTable[bVar50.m_bits & 7] = (Type *)(ast::builtins::Builtins::Instance + 0x1b8);
  thisSym_ = (RootSymbol *)operator_new(0x98);
  (thisSym_->super_Symbol).kind = Root;
  (thisSym_->super_Symbol).name._M_len = 5;
  *(char **)((long)&(thisSym_->super_Symbol).name + 8) = "$root";
  (thisSym_->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (thisSym_->super_Symbol).location = (SourceLocation)0x0;
  (thisSym_->super_Symbol).parentScope = (Scope *)0x0;
  *(undefined1 (*) [16])((long)&(thisSym_->super_Symbol).parentScope + 4) = (undefined1  [16])0x0;
  Scope::Scope(&thisSym_->super_Scope,this,(Symbol *)thisSym_);
  (thisSym_->compilationUnits)._M_ptr = (pointer)0x0;
  (thisSym_->compilationUnits)._M_extent = 0;
  (thisSym_->topInstances)._M_ptr = (pointer)0x0;
  (thisSym_->topInstances)._M_extent = 0;
  p = (this->root)._M_t.
      super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>.
      _M_t.
      super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
      .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
  (this->root)._M_t.
  super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>._M_t.
  super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>.
  super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl = thisSym_;
  if (p != (RootSymbol *)0x0) {
    operator_delete(p,0x98);
  }
  std::
  vector<std::shared_ptr<slang::ast::SystemSubroutine>,_std::allocator<std::shared_ptr<slang::ast::SystemSubroutine>_>_>
  ::operator=(local_340,
              (vector<std::shared_ptr<slang::ast::SystemSubroutine>,_std::allocator<std::shared_ptr<slang::ast::SystemSubroutine>_>_>
               *)(ast::builtins::Builtins::Instance + 0x8d8));
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  ::operator=(local_350,
              (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
               *)(ast::builtins::Builtins::Instance + 0x8f0));
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  ::operator=(local_348,
              (table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
               *)(ast::builtins::Builtins::Instance + 0x920));
  pPVar56 = ast::builtins::createStdPackage(this);
  phVar33 = local_398;
  *(PackageSymbol **)local_3a0 = pPVar56;
  sv = &(pPVar56->super_Symbol).name;
  ppVar57 = (value_type_pointer)
            hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                      (local_398,sv);
  uVar54 = (ulong)ppVar57 >> ((byte)*phVar33 & 0x3f);
  lVar63 = ((ulong)ppVar57 & 0xff) * 4;
  uVar80 = (&UNK_0048f58c)[lVar63];
  uVar107 = (&UNK_0048f58d)[lVar63];
  uVar108 = (&UNK_0048f58e)[lVar63];
  bVar109 = (&UNK_0048f58f)[lVar63];
  uVar64 = (ulong)((uint)ppVar57 & 7);
  uVar59 = 0;
  pSVar61 = (SourceLibrary *)uVar54;
  uVar110 = uVar80;
  uVar111 = uVar107;
  uVar112 = uVar108;
  bVar113 = bVar109;
  uVar114 = uVar80;
  uVar115 = uVar107;
  uVar116 = uVar108;
  bVar117 = bVar109;
  uVar118 = uVar80;
  uVar119 = uVar107;
  uVar120 = uVar108;
  bVar121 = bVar109;
  do {
    pgVar11 = (this->packageMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
              .arrays.groups_;
    pgVar4 = pgVar11 + (long)pSVar61;
    local_2a8 = pgVar4->m[0].n;
    uStack_2a7 = pgVar4->m[1].n;
    uStack_2a6 = pgVar4->m[2].n;
    bStack_2a5 = pgVar4->m[3].n;
    uStack_2a4 = pgVar4->m[4].n;
    uStack_2a3 = pgVar4->m[5].n;
    uStack_2a2 = pgVar4->m[6].n;
    bStack_2a1 = pgVar4->m[7].n;
    uStack_2a0 = pgVar4->m[8].n;
    uStack_29f = pgVar4->m[9].n;
    uStack_29e = pgVar4->m[10].n;
    bStack_29d = pgVar4->m[0xb].n;
    uStack_29c = pgVar4->m[0xc].n;
    uStack_29b = pgVar4->m[0xd].n;
    uStack_29a = pgVar4->m[0xe].n;
    bVar52 = pgVar4->m[0xf].n;
    auVar78[0] = -(local_2a8 == uVar80);
    auVar78[1] = -(uStack_2a7 == uVar107);
    auVar78[2] = -(uStack_2a6 == uVar108);
    auVar78[3] = -(bStack_2a5 == bVar109);
    auVar78[4] = -(uStack_2a4 == uVar110);
    auVar78[5] = -(uStack_2a3 == uVar111);
    auVar78[6] = -(uStack_2a2 == uVar112);
    auVar78[7] = -(bStack_2a1 == bVar113);
    auVar78[8] = -(uStack_2a0 == uVar114);
    auVar78[9] = -(uStack_29f == uVar115);
    auVar78[10] = -(uStack_29e == uVar116);
    auVar78[0xb] = -(bStack_29d == bVar117);
    auVar78[0xc] = -(uStack_29c == uVar118);
    auVar78[0xd] = -(uStack_29b == uVar119);
    auVar78[0xe] = -(uStack_29a == uVar120);
    auVar78[0xf] = -(bVar52 == bVar121);
    uVar60 = (uint)(ushort)((ushort)(SUB161(auVar78 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar78 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar78 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar78 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar78 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar78 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar78 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar78 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar78 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar78 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar78 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar78 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar78 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar78 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar78 >> 0x77,0) & 1) << 0xe);
    bStack_299 = bVar52;
    if (uVar60 != 0) {
      ppVar12 = (this->packageMap).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
                .arrays.elements_;
      local_390 = uVar59;
      local_380 = uVar64;
      local_378 = ppVar57;
      local_368 = pSVar61;
      local_338 = uVar80;
      uStack_337 = uVar107;
      uStack_336 = uVar108;
      bStack_335 = bVar109;
      uStack_334 = uVar110;
      uStack_333 = uVar111;
      uStack_332 = uVar112;
      bStack_331 = bVar113;
      uStack_330 = uVar114;
      uStack_32f = uVar115;
      uStack_32e = uVar116;
      bStack_32d = bVar117;
      uStack_32c = uVar118;
      uStack_32b = uVar119;
      uStack_32a = uVar120;
      bStack_329 = bVar121;
      do {
        uVar13 = 0;
        if (uVar60 != 0) {
          for (; (uVar60 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
          }
        }
        bVar51 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                           ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            local_398,sv,&ppVar12[(long)pSVar61 * 0xf + (ulong)uVar13].first);
        if (bVar51) goto LAB_002d4a93;
        uVar60 = uVar60 - 1 & uVar60;
      } while (uVar60 != 0);
      bVar52 = pgVar11[(long)pSVar61].m[0xf].n;
      uVar59 = local_390;
      pSVar61 = local_368;
      uVar64 = local_380;
      ppVar57 = local_378;
      uVar80 = local_338;
      uVar107 = uStack_337;
      uVar108 = uStack_336;
      bVar109 = bStack_335;
      uVar110 = uStack_334;
      uVar111 = uStack_333;
      uVar112 = uStack_332;
      bVar113 = bStack_331;
      uVar114 = uStack_330;
      uVar115 = uStack_32f;
      uVar116 = uStack_32e;
      bVar117 = bStack_32d;
      uVar118 = uStack_32c;
      uVar119 = uStack_32b;
      uVar120 = uStack_32a;
      bVar121 = bStack_329;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[uVar64] & bVar52) == 0) break;
    uVar62 = (this->packageMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
             .arrays.groups_size_mask;
    lVar63 = (long)pSVar61 + uVar59;
    uVar59 = uVar59 + 1;
    pSVar61 = (SourceLibrary *)(lVar63 + 1U & uVar62);
  } while (uVar59 <= uVar62);
  if ((this->packageMap).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
      .size_ctrl.size <
      (this->packageMap).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PackageSymbol_const*>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::PackageSymbol_const*&>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PackageSymbol_const*>>>
                *)local_398,(arrays_type *)local_398,uVar54,(size_t)ppVar57,
               (try_emplace_args_t *)&local_3d8,sv,(PackageSymbol **)local_3a0);
    psVar1 = &(this->packageMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PackageSymbol_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::PackageSymbol_const*&>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PackageSymbol_const*>>>
                *)local_398,(size_t)ppVar57,(try_emplace_args_t *)&local_3d8,sv,
               (PackageSymbol **)local_3a0);
  }
LAB_002d4a93:
  ast::builtins::registerGateTypes(this);
  pSVar61 = this->defaultLibPtr;
  if (pSVar61 == (SourceLibrary *)0x0) {
    local_3c8._16_4_ = 0x6b726f77;
    uStack_3b4 = uStack_3b4 & 0xffffff00;
    plVar58 = (long *)operator_new(0x40);
    pgVar6 = (group15<boost::unordered::detail::foa::plain_integral> *)(local_3c8 + 0x10);
    *plVar58 = (long)(plVar58 + 2);
    plVar58[2] = CONCAT44(uStack_3b4,local_3c8._16_4_);
    plVar58[3] = lStack_3b0;
    plVar58[1] = 4;
    local_3c8._8_8_ = 0;
    local_3c8._16_4_ = local_3c8._16_4_ & 0xffffff00;
    plVar58[6] = 0;
    *(undefined1 (*) [16])(plVar58 + 4) = (undefined1  [16])0x0;
    *(undefined4 *)(plVar58 + 7) = 0x7fffffff;
    *(undefined1 *)((long)plVar58 + 0x3c) = 0;
    local_3d8._M_len = 0;
    pSVar61 = *(SourceLibrary **)local_370;
    *(long **)local_370 = plVar58;
    local_3c8._0_8_ = pgVar6;
    if ((pSVar61 != (SourceLibrary *)0x0) &&
       (std::default_delete<slang::SourceLibrary>::operator()(local_370,pSVar61),
       (SourceLibrary *)local_3d8._M_len != (SourceLibrary *)0x0)) {
      std::default_delete<slang::SourceLibrary>::operator()
                ((default_delete<slang::SourceLibrary> *)&local_3d8,
                 (SourceLibrary *)local_3d8._M_len);
    }
    local_3d8._M_len = 0;
    if ((group15<boost::unordered::detail::foa::plain_integral> *)local_3c8._0_8_ != pgVar6) {
      operator_delete((void *)local_3c8._0_8_,CONCAT44(uStack_3b4,local_3c8._16_4_) + 1);
    }
    pSVar61 = (this->defaultLibMem)._M_t.
              super___uniq_ptr_impl<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>
              ._M_t.
              super__Tuple_impl<0UL,_slang::SourceLibrary_*,_std::default_delete<slang::SourceLibrary>_>
              .super__Head_base<0UL,_slang::SourceLibrary_*,_false>._M_head_impl;
    pSVar61->isDefault = true;
    this->defaultLibPtr = pSVar61;
  }
  local_3d8._M_str = (pSVar61->name)._M_dataplus._M_p;
  local_3d8._M_len = (pSVar61->name)._M_string_length;
  local_368 = pSVar61;
  local_358 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                        (local_388,&local_3d8);
  __n = local_3d8._M_len;
  uVar64 = local_358 >>
           ((byte)(this->libraryNameMap).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  local_2c0 = (this->libraryNameMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
              .arrays.groups_;
  lVar63 = (local_358 & 0xff) * 4;
  uVar80 = (&UNK_0048f58c)[lVar63];
  uVar107 = (&UNK_0048f58d)[lVar63];
  uVar108 = (&UNK_0048f58e)[lVar63];
  bVar109 = (&UNK_0048f58f)[lVar63];
  local_378 = (this->libraryNameMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
              .arrays.elements_;
  local_3a0 = (SourceLibrary *)local_3d8._M_str;
  local_2c8 = (ulong)((uint)local_358 & 7);
  local_320 = (this->libraryNameMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
              .arrays.groups_size_mask;
  uVar59 = 0;
  uVar110 = uVar80;
  uVar111 = uVar107;
  uVar112 = uVar108;
  bVar113 = bVar109;
  uVar114 = uVar80;
  uVar115 = uVar107;
  uVar116 = uVar108;
  bVar117 = bVar109;
  uVar118 = uVar80;
  uVar119 = uVar107;
  uVar120 = uVar108;
  bVar121 = bVar109;
  local_2d0 = uVar64;
  do {
    ppVar57 = local_378;
    pgVar5 = local_2c0 + uVar64;
    local_2b8 = pgVar5->m[0].n;
    uStack_2b7 = pgVar5->m[1].n;
    uStack_2b6 = pgVar5->m[2].n;
    bStack_2b5 = pgVar5->m[3].n;
    uStack_2b4 = pgVar5->m[4].n;
    uStack_2b3 = pgVar5->m[5].n;
    uStack_2b2 = pgVar5->m[6].n;
    bStack_2b1 = pgVar5->m[7].n;
    uStack_2b0 = pgVar5->m[8].n;
    uStack_2af = pgVar5->m[9].n;
    uStack_2ae = pgVar5->m[10].n;
    bStack_2ad = pgVar5->m[0xb].n;
    uStack_2ac = pgVar5->m[0xc].n;
    uStack_2ab = pgVar5->m[0xd].n;
    uStack_2aa = pgVar5->m[0xe].n;
    bStack_2a9 = pgVar5->m[0xf].n;
    auVar79[0] = -(local_2b8 == uVar80);
    auVar79[1] = -(uStack_2b7 == uVar107);
    auVar79[2] = -(uStack_2b6 == uVar108);
    auVar79[3] = -(bStack_2b5 == bVar109);
    auVar79[4] = -(uStack_2b4 == uVar110);
    auVar79[5] = -(uStack_2b3 == uVar111);
    auVar79[6] = -(uStack_2b2 == uVar112);
    auVar79[7] = -(bStack_2b1 == bVar113);
    auVar79[8] = -(uStack_2b0 == uVar114);
    auVar79[9] = -(uStack_2af == uVar115);
    auVar79[10] = -(uStack_2ae == uVar116);
    auVar79[0xb] = -(bStack_2ad == bVar117);
    auVar79[0xc] = -(uStack_2ac == uVar118);
    auVar79[0xd] = -(uStack_2ab == uVar119);
    auVar79[0xe] = -(uStack_2aa == uVar120);
    auVar79[0xf] = -(bStack_2a9 == bVar121);
    local_380 = CONCAT71(local_380._1_7_,bStack_2a9);
    local_390 = uVar64;
    uVar34 = uVar80;
    uVar35 = uVar107;
    uVar36 = uVar108;
    bVar37 = bVar109;
    uVar38 = uVar110;
    uVar39 = uVar111;
    uVar40 = uVar112;
    bVar41 = bVar113;
    uVar42 = uVar114;
    uVar43 = uVar115;
    uVar44 = uVar116;
    bVar45 = bVar117;
    uVar46 = uVar118;
    uVar47 = uVar119;
    uVar48 = uVar120;
    bVar49 = bVar121;
    uVar17 = local_338;
    uVar18 = uStack_337;
    uVar19 = uStack_336;
    bVar52 = bStack_335;
    uVar20 = uStack_334;
    uVar21 = uStack_333;
    uVar22 = uStack_332;
    bVar23 = bStack_331;
    uVar24 = uStack_330;
    uVar25 = uStack_32f;
    uVar26 = uStack_32e;
    bVar27 = bStack_32d;
    uVar28 = uStack_32c;
    uVar29 = uStack_32b;
    uVar30 = uStack_32a;
    bVar31 = bStack_329;
    for (uVar60 = (uint)(ushort)((ushort)(SUB161(auVar79 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar79 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar79 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar79 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar79 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar79 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar79 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar79 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar79 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar79 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar79 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar79 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar79 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar79 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar79 >> 0x77,0) & 1) << 0xe); bStack_329 = bVar49
        , uStack_32a = uVar48, uStack_32b = uVar47, uStack_32c = uVar46, bStack_32d = bVar45,
        uStack_32e = uVar44, uStack_32f = uVar43, uStack_330 = uVar42, bStack_331 = bVar41,
        uStack_332 = uVar40, uStack_333 = uVar39, uStack_334 = uVar38, bStack_335 = bVar37,
        uStack_336 = uVar36, uStack_337 = uVar35, local_338 = uVar34, uVar60 != 0;
        uVar60 = uVar60 - 1 & uVar60) {
      uVar13 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
        }
      }
      uVar54 = (ulong)uVar13;
      if ((__n == ppVar57[uVar64 * 0xf + uVar54].first._M_len) &&
         ((ppVar65 = ppVar57 + uVar64 * 0xf + uVar54, __n == 0 ||
          (iVar53 = bcmp(local_3a0,ppVar57[uVar64 * 0xf + uVar54].first._M_str,__n),
          uVar80 = local_338, uVar107 = uStack_337, uVar108 = uStack_336, bVar109 = bStack_335,
          uVar110 = uStack_334, uVar111 = uStack_333, uVar112 = uStack_332, bVar113 = bStack_331,
          uVar114 = uStack_330, uVar115 = uStack_32f, uVar116 = uStack_32e, bVar117 = bStack_32d,
          uVar118 = uStack_32c, uVar119 = uStack_32b, uVar120 = uStack_32a, bVar121 = bStack_329,
          iVar53 == 0)))) goto LAB_002d4d61;
      uVar34 = local_338;
      uVar35 = uStack_337;
      uVar36 = uStack_336;
      bVar37 = bStack_335;
      uVar38 = uStack_334;
      uVar39 = uStack_333;
      uVar40 = uStack_332;
      bVar41 = bStack_331;
      uVar42 = uStack_330;
      uVar43 = uStack_32f;
      uVar44 = uStack_32e;
      bVar45 = bStack_32d;
      uVar46 = uStack_32c;
      uVar47 = uStack_32b;
      uVar48 = uStack_32a;
      bVar49 = bStack_329;
      uVar17 = local_338;
      uVar18 = uStack_337;
      uVar19 = uStack_336;
      bVar52 = bStack_335;
      uVar20 = uStack_334;
      uVar21 = uStack_333;
      uVar22 = uStack_332;
      bVar23 = bStack_331;
      uVar24 = uStack_330;
      uVar25 = uStack_32f;
      uVar26 = uStack_32e;
      bVar27 = bStack_32d;
      uVar28 = uStack_32c;
      uVar29 = uStack_32b;
      uVar30 = uStack_32a;
      bVar31 = bStack_329;
    }
    local_338 = uVar17;
    uStack_337 = uVar18;
    uStack_336 = uVar19;
    bStack_335 = bVar52;
    uStack_334 = uVar20;
    uStack_333 = uVar21;
    uStack_332 = uVar22;
    bStack_331 = bVar23;
    uStack_330 = uVar24;
    uStack_32f = uVar25;
    uStack_32e = uVar26;
    bStack_32d = bVar27;
    uStack_32c = uVar28;
    uStack_32b = uVar29;
    uStack_32a = uVar30;
    bStack_329 = bVar31;
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[local_2c8] & (byte)local_380) == 0) break;
    lVar63 = local_390 + uVar59;
    uVar59 = uVar59 + 1;
    uVar64 = lVar63 + 1U & local_320;
  } while (uVar59 <= local_320);
  if ((this->libraryNameMap).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
      .size_ctrl.size <
      (this->libraryNameMap).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
                *)local_388,(arrays_type *)local_388,local_2d0,local_358,&local_3d9,&local_3d8);
    psVar1 = &(this->libraryNameMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_3c8,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
                *)local_388,local_358,&local_3d9,&local_3d8);
  }
  ppVar65 = (value_type_pointer)CONCAT44(uStack_3b4,local_3c8._16_4_);
LAB_002d4d61:
  ppVar65->second = local_368;
  local_3c8._0_8_ = &local_3d8;
  *in_FS_OFFSET = (long)local_3c8;
  *in_FS_OFFSET =
       (long)std::once_flag::_Prepare_execution::
             _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
             ::anon_class_1_0_00000001::__invoke;
  iVar53 = pthread_once(&Compilation::onceFlag._M_once,__once_proxy);
  if (iVar53 != 0) {
    std::__throw_system_error(iVar53);
  }
  *in_FS_OFFSET = 0;
  *in_FS_OFFSET = 0;
  this->nextEnumSystemId = 1;
  this->nextStructSystemId = 1;
  this->nextUnionSystemId = 1;
  return;
}

Assistant:

Compilation::Compilation(const Bag& options, const SourceLibrary* defaultLib) :
    options(options.getOrDefault<CompilationOptions>()), driverMapAllocator(*this),
    unrollIntervalMapAllocator(*this), tempDiag({}, {}), netAliasAllocator(*this),
    defaultLibPtr(defaultLib) {

    // Construct all built-in types.
    auto& bi = slang::ast::builtins::Builtins::Instance;
    bitType = &bi.bitType;
    logicType = &bi.logicType;
    intType = &bi.intType;
    byteType = &bi.byteType;
    integerType = &bi.integerType;
    realType = &bi.realType;
    shortRealType = &bi.shortRealType;
    stringType = &bi.stringType;
    voidType = &bi.voidType;
    errorType = &bi.errorType;

    auto regType = &bi.regType;
    auto signedBitType = &bi.signedBitType;
    auto signedLogicType = &bi.signedLogicType;
    auto signedRegType = &bi.signedRegType;
    auto shortIntType = &bi.shortIntType;
    auto longIntType = &bi.longIntType;
    auto timeType = &bi.timeType;
    auto realTimeType = &bi.realTimeType;
    auto chandleType = &bi.chandleType;
    auto nullType = &bi.nullType;
    auto eventType = &bi.eventType;
    auto unboundedType = &bi.unboundedType;
    auto typeRefType = &bi.typeRefType;
    auto untypedType = &bi.untypedType;
    auto sequenceType = &bi.sequenceType;
    auto propertyType = &bi.propertyType;

    // Register built-in types for lookup by syntax kind.
    knownTypes.reserve(32);
    knownTypes[SyntaxKind::ShortIntType] = shortIntType;
    knownTypes[SyntaxKind::IntType] = intType;
    knownTypes[SyntaxKind::LongIntType] = longIntType;
    knownTypes[SyntaxKind::ByteType] = byteType;
    knownTypes[SyntaxKind::BitType] = bitType;
    knownTypes[SyntaxKind::LogicType] = logicType;
    knownTypes[SyntaxKind::RegType] = regType;
    knownTypes[SyntaxKind::IntegerType] = integerType;
    knownTypes[SyntaxKind::TimeType] = timeType;
    knownTypes[SyntaxKind::RealType] = realType;
    knownTypes[SyntaxKind::RealTimeType] = realTimeType;
    knownTypes[SyntaxKind::ShortRealType] = shortRealType;
    knownTypes[SyntaxKind::StringType] = stringType;
    knownTypes[SyntaxKind::CHandleType] = chandleType;
    knownTypes[SyntaxKind::NullLiteralExpression] = nullType;
    knownTypes[SyntaxKind::VoidType] = voidType;
    knownTypes[SyntaxKind::EventType] = eventType;
    knownTypes[SyntaxKind::WildcardLiteralExpression] = unboundedType;
    knownTypes[SyntaxKind::TypeReference] = typeRefType;
    knownTypes[SyntaxKind::Untyped] = untypedType;
    knownTypes[SyntaxKind::SequenceType] = sequenceType;
    knownTypes[SyntaxKind::PropertyType] = propertyType;
    knownTypes[SyntaxKind::Unknown] = errorType;

#define MAKE_NETTYPE(type)                                               \
    knownNetTypes[TokenKind::type##Keyword] = std::make_unique<NetType>( \
        NetType::type, LexerFacts::getTokenKindText(TokenKind::type##Keyword), *logicType)

    knownNetTypes.reserve(16);
    MAKE_NETTYPE(Wire);
    MAKE_NETTYPE(WAnd);
    MAKE_NETTYPE(WOr);
    MAKE_NETTYPE(Tri);
    MAKE_NETTYPE(TriAnd);
    MAKE_NETTYPE(TriOr);
    MAKE_NETTYPE(Tri0);
    MAKE_NETTYPE(Tri1);
    MAKE_NETTYPE(TriReg);
    MAKE_NETTYPE(Supply0);
    MAKE_NETTYPE(Supply1);
    MAKE_NETTYPE(UWire);
    MAKE_NETTYPE(Interconnect);

    knownNetTypes[TokenKind::Unknown] = std::make_unique<NetType>(NetType::Unknown, "<error>",
                                                                  *logicType);
    wireNetType = knownNetTypes[TokenKind::WireKeyword].get();

#undef MAKE_NETTYPE

    // Scalar types are indexed by bit flags.
    auto registerScalar = [this](auto type) {
        scalarTypeTable[type->getIntegralFlags().bits() & 0x7] = type;
    };
    registerScalar(bitType);
    registerScalar(logicType);
    registerScalar(regType);
    registerScalar(signedBitType);
    registerScalar(signedLogicType);
    registerScalar(signedRegType);

    root = std::make_unique<RootSymbol>(*this);

    // Copy in all built-in system tasks, functions, and methods.
    systemSubroutines = bi.systemSubroutines;
    subroutineNameMap = bi.subroutineNameMap;
    methodMap = bi.methodMap;

    // Register the built-in std package.
    stdPkg = &builtins::createStdPackage(*this);
    packageMap.emplace(stdPkg->name, stdPkg);

    // Register the built-in gate types.
    builtins::registerGateTypes(*this);

    // Register the default library.
    if (defaultLibPtr) {
        SLANG_ASSERT(defaultLibPtr->isDefault);
    }
    else {
        defaultLibMem = std::make_unique<SourceLibrary>("work"s, INT_MAX);
        defaultLibMem->isDefault = true;
        defaultLibPtr = defaultLibMem.get();
    }
    libraryNameMap[defaultLibPtr->name] = defaultLibPtr;

    // Set a default handler for printing types and symbol paths, for convenience.
    static std::once_flag onceFlag;
    std::call_once(onceFlag, [] {
        DiagnosticEngine::setDefaultFormatter<const Type*>(std::make_unique<TypeArgFormatter>());
        DiagnosticEngine::setDefaultSymbolPathCB(
            [](const Symbol& sym) { return sym.getHierarchicalPath(); });
    });

    // Reset systemId counters that may have been changed due to creation of types
    // in the std package.
    nextEnumSystemId = 1;
    nextStructSystemId = 1;
    nextUnionSystemId = 1;
}